

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined4 uVar81;
  vint4 bi_2;
  undefined1 auVar82 [16];
  float fVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vint4 bi;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar115;
  float fVar116;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar117;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vint4 ai_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  vint4 ai;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vint4 ai_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  vfloat4 a0_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar185;
  float fVar196;
  float fVar198;
  vfloat4 a0_1;
  float fVar200;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar199;
  float fVar201;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar212;
  float fVar213;
  vfloat4 a0;
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_304;
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  RTCFilterFunctionNArguments local_288;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar19;
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar225 [32];
  
  PVar4 = prim[1];
  uVar24 = (ulong)(byte)PVar4;
  fVar204 = *(float *)(prim + uVar24 * 0x19 + 0x12);
  auVar30 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar24 * 0x19 + 6));
  auVar109._0_4_ = fVar204 * auVar30._0_4_;
  auVar109._4_4_ = fVar204 * auVar30._4_4_;
  auVar109._8_4_ = fVar204 * auVar30._8_4_;
  auVar109._12_4_ = fVar204 * auVar30._12_4_;
  auVar44._0_4_ = fVar204 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar44._4_4_ = fVar204 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar44._8_4_ = fVar204 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar44._12_4_ = fVar204 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xb + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar24 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  uVar29 = (ulong)(uint)((int)(uVar24 * 9) * 2);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 + uVar24 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  uVar18 = (ulong)(uint)((int)(uVar24 * 5) << 2);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar18 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar215._4_4_ = auVar44._0_4_;
  auVar215._0_4_ = auVar44._0_4_;
  auVar215._8_4_ = auVar44._0_4_;
  auVar215._12_4_ = auVar44._0_4_;
  auVar45 = vshufps_avx(auVar44,auVar44,0x55);
  auVar33 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar204 = auVar33._0_4_;
  auVar46._0_4_ = fVar204 * auVar32._0_4_;
  fVar185 = auVar33._4_4_;
  auVar46._4_4_ = fVar185 * auVar32._4_4_;
  fVar197 = auVar33._8_4_;
  auVar46._8_4_ = fVar197 * auVar32._8_4_;
  fVar199 = auVar33._12_4_;
  auVar46._12_4_ = fVar199 * auVar32._12_4_;
  auVar42._0_4_ = auVar39._0_4_ * fVar204;
  auVar42._4_4_ = auVar39._4_4_ * fVar185;
  auVar42._8_4_ = auVar39._8_4_ * fVar197;
  auVar42._12_4_ = auVar39._12_4_ * fVar199;
  auVar48._0_4_ = auVar34._0_4_ * fVar204;
  auVar48._4_4_ = auVar34._4_4_ * fVar185;
  auVar48._8_4_ = auVar34._8_4_ * fVar197;
  auVar48._12_4_ = auVar34._12_4_ * fVar199;
  auVar33 = vfmadd231ps_fma(auVar46,auVar45,auVar31);
  auVar35 = vfmadd231ps_fma(auVar42,auVar45,auVar40);
  auVar45 = vfmadd231ps_fma(auVar48,auVar37,auVar45);
  auVar36 = vfmadd231ps_fma(auVar33,auVar215,auVar30);
  auVar35 = vfmadd231ps_fma(auVar35,auVar215,auVar41);
  auVar44 = vfmadd231ps_fma(auVar45,auVar38,auVar215);
  auVar216._4_4_ = auVar109._0_4_;
  auVar216._0_4_ = auVar109._0_4_;
  auVar216._8_4_ = auVar109._0_4_;
  auVar216._12_4_ = auVar109._0_4_;
  auVar45 = vshufps_avx(auVar109,auVar109,0x55);
  auVar33 = vshufps_avx(auVar109,auVar109,0xaa);
  fVar204 = auVar33._0_4_;
  auVar226._0_4_ = fVar204 * auVar32._0_4_;
  fVar185 = auVar33._4_4_;
  auVar226._4_4_ = fVar185 * auVar32._4_4_;
  fVar197 = auVar33._8_4_;
  auVar226._8_4_ = fVar197 * auVar32._8_4_;
  fVar199 = auVar33._12_4_;
  auVar226._12_4_ = fVar199 * auVar32._12_4_;
  auVar118._0_4_ = auVar39._0_4_ * fVar204;
  auVar118._4_4_ = auVar39._4_4_ * fVar185;
  auVar118._8_4_ = auVar39._8_4_ * fVar197;
  auVar118._12_4_ = auVar39._12_4_ * fVar199;
  auVar110._0_4_ = auVar34._0_4_ * fVar204;
  auVar110._4_4_ = auVar34._4_4_ * fVar185;
  auVar110._8_4_ = auVar34._8_4_ * fVar197;
  auVar110._12_4_ = auVar34._12_4_ * fVar199;
  auVar31 = vfmadd231ps_fma(auVar226,auVar45,auVar31);
  auVar32 = vfmadd231ps_fma(auVar118,auVar45,auVar40);
  auVar40 = vfmadd231ps_fma(auVar110,auVar45,auVar37);
  auVar39 = vfmadd231ps_fma(auVar31,auVar216,auVar30);
  auVar37 = vfmadd231ps_fma(auVar32,auVar216,auVar41);
  auVar66._16_16_ = in_YmmResult._16_16_;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar30);
  auVar34 = vfmadd231ps_fma(auVar40,auVar216,auVar38);
  auVar31 = vandps_avx512vl(auVar36,auVar30);
  auVar142._8_4_ = 0x219392ef;
  auVar142._0_8_ = 0x219392ef219392ef;
  auVar142._12_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar31,auVar142,1);
  bVar27 = (bool)((byte)uVar29 & 1);
  auVar33._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar36._0_4_;
  bVar27 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar33._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar36._4_4_;
  bVar27 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar33._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar36._8_4_;
  bVar27 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar33._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar36._12_4_;
  auVar31 = vandps_avx512vl(auVar35,auVar30);
  uVar29 = vcmpps_avx512vl(auVar31,auVar142,1);
  bVar27 = (bool)((byte)uVar29 & 1);
  auVar36._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._0_4_;
  bVar27 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._4_4_;
  bVar27 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._8_4_;
  bVar27 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar35._12_4_;
  auVar30 = vandps_avx512vl(auVar44,auVar30);
  uVar29 = vcmpps_avx512vl(auVar30,auVar142,1);
  bVar27 = (bool)((byte)uVar29 & 1);
  auVar35._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar44._0_4_;
  bVar27 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar44._4_4_;
  bVar27 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar44._8_4_;
  bVar27 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar44._12_4_;
  auVar30 = vrcp14ps_avx512vl(auVar33);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar238 = ZEXT1664(auVar31);
  auVar32 = vfnmadd213ps_avx512vl(auVar33,auVar30,auVar31);
  auVar41 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar36);
  auVar32 = vfnmadd213ps_avx512vl(auVar36,auVar30,auVar31);
  auVar40 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar35);
  auVar31 = vfnmadd213ps_avx512vl(auVar35,auVar30,auVar31);
  auVar38 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar39);
  auVar127._0_4_ = auVar41._0_4_ * auVar30._0_4_;
  auVar127._4_4_ = auVar41._4_4_ * auVar30._4_4_;
  auVar127._8_4_ = auVar41._8_4_ * auVar30._8_4_;
  auVar127._12_4_ = auVar41._12_4_ * auVar30._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar30 = vpmovsxwd_avx(auVar31);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar39);
  auVar33 = vpbroadcastd_avx512vl();
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar31 = vpmovsxwd_avx(auVar32);
  auVar47._0_4_ = auVar41._0_4_ * auVar30._0_4_;
  auVar47._4_4_ = auVar41._4_4_ * auVar30._4_4_;
  auVar47._8_4_ = auVar41._8_4_ * auVar30._8_4_;
  auVar47._12_4_ = auVar41._12_4_ * auVar30._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar24 * -2 + 6);
  auVar30 = vpmovsxwd_avx(auVar41);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar37);
  auVar143._0_4_ = auVar40._0_4_ * auVar30._0_4_;
  auVar143._4_4_ = auVar40._4_4_ * auVar30._4_4_;
  auVar143._8_4_ = auVar40._8_4_ * auVar30._8_4_;
  auVar143._12_4_ = auVar40._12_4_ * auVar30._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar31);
  auVar30 = vsubps_avx(auVar30,auVar37);
  auVar43._0_4_ = auVar40._0_4_ * auVar30._0_4_;
  auVar43._4_4_ = auVar40._4_4_ * auVar30._4_4_;
  auVar43._8_4_ = auVar40._8_4_ * auVar30._8_4_;
  auVar43._12_4_ = auVar40._12_4_ * auVar30._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar18 + uVar24 + 6);
  auVar30 = vpmovsxwd_avx(auVar40);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar34);
  auVar119._0_4_ = auVar38._0_4_ * auVar30._0_4_;
  auVar119._4_4_ = auVar38._4_4_ * auVar30._4_4_;
  auVar119._8_4_ = auVar38._8_4_ * auVar30._8_4_;
  auVar119._12_4_ = auVar38._12_4_ * auVar30._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar24 * 0x17 + 6);
  auVar30 = vpmovsxwd_avx(auVar39);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar34);
  auVar82._0_4_ = auVar38._0_4_ * auVar30._0_4_;
  auVar82._4_4_ = auVar38._4_4_ * auVar30._4_4_;
  auVar82._8_4_ = auVar38._8_4_ * auVar30._8_4_;
  auVar82._12_4_ = auVar38._12_4_ * auVar30._12_4_;
  auVar30 = vpminsd_avx(auVar127,auVar47);
  auVar31 = vpminsd_avx(auVar143,auVar43);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar31 = vpminsd_avx(auVar119,auVar82);
  uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar38._4_4_ = uVar81;
  auVar38._0_4_ = uVar81;
  auVar38._8_4_ = uVar81;
  auVar38._12_4_ = uVar81;
  auVar31 = vmaxps_avx512vl(auVar31,auVar38);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar37._8_4_ = 0x3f7ffffa;
  auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar37._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar30,auVar37);
  auVar30 = vpmaxsd_avx(auVar127,auVar47);
  auVar31 = vpmaxsd_avx(auVar143,auVar43);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar31 = vpmaxsd_avx(auVar119,auVar82);
  fVar204 = (ray->super_RayK<1>).tfar;
  auVar34._4_4_ = fVar204;
  auVar34._0_4_ = fVar204;
  auVar34._8_4_ = fVar204;
  auVar34._12_4_ = fVar204;
  auVar31 = vminps_avx512vl(auVar31,auVar34);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar45._8_4_ = 0x3f800003;
  auVar45._0_8_ = 0x3f8000033f800003;
  auVar45._12_4_ = 0x3f800003;
  auVar30 = vmulps_avx512vl(auVar30,auVar45);
  uVar10 = vcmpps_avx512vl(local_158,auVar30,2);
  uVar29 = vpcmpgtd_avx512vl(auVar33,_DAT_01f7fcf0);
  uVar29 = ((byte)uVar10 & 0xf) & uVar29;
  if ((char)uVar29 != '\0') {
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar232 = ZEXT1664(auVar30);
    auVar66._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar233 = ZEXT1664(auVar66._0_16_);
    auVar239 = ZEXT464(0x3f800000);
    do {
      lVar20 = 0;
      for (uVar18 = uVar29; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar23 = *(uint *)(prim + 2);
      pGVar6 = (context->scene->geometries).items[uVar23].ptr;
      local_300 = (ulong)*(uint *)(prim + lVar20 * 4 + 6);
      uVar18 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar20 * 4 + 6));
      p_Var7 = pGVar6[1].intersectionFilterN;
      pvVar8 = pGVar6[2].userPtr;
      _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar30 = *(undefined1 (*) [16])(_Var9 + uVar18 * (long)pvVar8);
      auVar31 = *(undefined1 (*) [16])(_Var9 + (uVar18 + 1) * (long)pvVar8);
      auVar32 = *(undefined1 (*) [16])(_Var9 + (uVar18 + 2) * (long)pvVar8);
      auVar41 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar18 + 3));
      lVar20 = *(long *)&pGVar6[1].time_range.upper;
      auVar40 = *(undefined1 (*) [16])(lVar20 + (long)p_Var7 * uVar18);
      auVar39 = *(undefined1 (*) [16])(lVar20 + (long)p_Var7 * (uVar18 + 1));
      auVar38 = *(undefined1 (*) [16])(lVar20 + (long)p_Var7 * (uVar18 + 2));
      uVar29 = uVar29 - 1 & uVar29;
      auVar37 = *(undefined1 (*) [16])(lVar20 + (long)p_Var7 * (uVar18 + 3));
      if (uVar29 != 0) {
        uVar24 = uVar29 - 1 & uVar29;
        for (uVar18 = uVar29; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        }
        if (uVar24 != 0) {
          for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar64._16_16_ = auVar66._16_16_;
      auVar64._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar33 = vmulps_avx512vl(auVar37,auVar64._0_16_);
      auVar221._8_4_ = 0x3e2aaaab;
      auVar221._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar221._12_4_ = 0x3e2aaaab;
      auVar34 = vfmadd213ps_fma(auVar221,auVar38,auVar33);
      auVar217._8_4_ = 0x3f2aaaab;
      auVar217._0_8_ = 0x3f2aaaab3f2aaaab;
      auVar217._12_4_ = 0x3f2aaaab;
      auVar34 = vfmadd231ps_fma(auVar34,auVar39,auVar217);
      auVar45 = vfmadd231ps_fma(auVar34,auVar40,auVar221);
      auVar44 = auVar232._0_16_;
      auVar34 = vfmadd231ps_avx512vl(auVar33,auVar38,auVar44);
      auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar39,auVar64._0_16_);
      auVar35 = vfnmadd231ps_avx512vl(auVar34,auVar40,auVar44);
      auVar33 = vmulps_avx512vl(auVar41,auVar64._0_16_);
      auVar34 = vfmadd213ps_fma(auVar221,auVar32,auVar33);
      auVar34 = vfmadd231ps_fma(auVar34,auVar31,auVar217);
      auVar34 = vfmadd231ps_fma(auVar34,auVar30,auVar221);
      auVar33 = vfmadd231ps_avx512vl(auVar33,auVar32,auVar44);
      auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar31,auVar64._0_16_);
      auVar36 = vfnmadd231ps_avx512vl(auVar33,auVar30,auVar44);
      auVar97._0_4_ = auVar37._0_4_ * 0.16666667;
      auVar97._4_4_ = auVar37._4_4_ * 0.16666667;
      auVar97._8_4_ = auVar37._8_4_ * 0.16666667;
      auVar97._12_4_ = auVar37._12_4_ * 0.16666667;
      auVar33 = vfmadd231ps_fma(auVar97,auVar38,auVar217);
      auVar33 = vfmadd231ps_fma(auVar33,auVar39,auVar221);
      auVar33 = vfmadd231ps_avx512vl(auVar33,auVar40,auVar64._0_16_);
      auVar37 = vmulps_avx512vl(auVar37,auVar44);
      auVar38 = vfmadd231ps_avx512vl(auVar37,auVar64._0_16_,auVar38);
      auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar44,auVar39);
      auVar38 = vfnmadd231ps_avx512vl(auVar39,auVar64._0_16_,auVar40);
      auVar160._0_4_ = auVar41._0_4_ * 0.16666667;
      auVar160._4_4_ = auVar41._4_4_ * 0.16666667;
      auVar160._8_4_ = auVar41._8_4_ * 0.16666667;
      auVar160._12_4_ = auVar41._12_4_ * 0.16666667;
      auVar40 = vfmadd231ps_fma(auVar160,auVar32,auVar217);
      auVar40 = vfmadd231ps_fma(auVar40,auVar31,auVar221);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar30,auVar64._0_16_);
      auVar41 = vmulps_avx512vl(auVar41,auVar44);
      auVar32 = vfmadd231ps_avx512vl(auVar41,auVar64._0_16_,auVar32);
      auVar31 = vfnmadd231ps_avx512vl(auVar32,auVar44,auVar31);
      auVar39 = vfnmadd231ps_avx512vl(auVar31,auVar64._0_16_,auVar30);
      auVar30 = vshufps_avx(auVar35,auVar35,0xc9);
      auVar31 = vshufps_avx(auVar34,auVar34,0xc9);
      fVar201 = auVar35._0_4_;
      auVar128._0_4_ = fVar201 * auVar31._0_4_;
      fVar202 = auVar35._4_4_;
      auVar128._4_4_ = fVar202 * auVar31._4_4_;
      fVar203 = auVar35._8_4_;
      auVar128._8_4_ = fVar203 * auVar31._8_4_;
      fVar91 = auVar35._12_4_;
      auVar128._12_4_ = fVar91 * auVar31._12_4_;
      auVar31 = vfmsub231ps_fma(auVar128,auVar30,auVar34);
      auVar32 = vshufps_avx(auVar31,auVar31,0xc9);
      auVar31 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar129._0_4_ = fVar201 * auVar31._0_4_;
      auVar129._4_4_ = fVar202 * auVar31._4_4_;
      auVar129._8_4_ = fVar203 * auVar31._8_4_;
      auVar129._12_4_ = fVar91 * auVar31._12_4_;
      auVar30 = vfmsub231ps_fma(auVar129,auVar30,auVar36);
      auVar41 = vshufps_avx(auVar30,auVar30,0xc9);
      auVar30 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar31 = vshufps_avx(auVar40,auVar40,0xc9);
      fVar108 = auVar38._0_4_;
      auVar120._0_4_ = fVar108 * auVar31._0_4_;
      fVar115 = auVar38._4_4_;
      auVar120._4_4_ = fVar115 * auVar31._4_4_;
      fVar116 = auVar38._8_4_;
      auVar120._8_4_ = fVar116 * auVar31._8_4_;
      fVar117 = auVar38._12_4_;
      auVar120._12_4_ = fVar117 * auVar31._12_4_;
      auVar31 = vfmsub231ps_fma(auVar120,auVar30,auVar40);
      auVar40 = vshufps_avx(auVar31,auVar31,0xc9);
      auVar31 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar161._0_4_ = auVar31._0_4_ * fVar108;
      auVar161._4_4_ = auVar31._4_4_ * fVar115;
      auVar161._8_4_ = auVar31._8_4_ * fVar116;
      auVar161._12_4_ = auVar31._12_4_ * fVar117;
      auVar31 = vfmsub231ps_fma(auVar161,auVar30,auVar39);
      auVar30 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar39 = vshufps_avx(auVar31,auVar31,0xc9);
      fVar185 = auVar30._0_4_;
      auVar49._4_28_ = auVar64._4_28_;
      auVar49._0_4_ = fVar185;
      auVar31 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar49._0_16_);
      fVar204 = auVar31._0_4_;
      auVar31 = vdpps_avx(auVar32,auVar41,0x7f);
      fVar204 = fVar204 * 1.5 + fVar185 * -0.5 * fVar204 * fVar204 * fVar204;
      fVar184 = fVar204 * auVar32._0_4_;
      fVar196 = fVar204 * auVar32._4_4_;
      fVar198 = fVar204 * auVar32._8_4_;
      fVar200 = fVar204 * auVar32._12_4_;
      auVar168._0_4_ = auVar41._0_4_ * fVar185;
      auVar168._4_4_ = auVar41._4_4_ * fVar185;
      auVar168._8_4_ = auVar41._8_4_ * fVar185;
      auVar168._12_4_ = auVar41._12_4_ * fVar185;
      fVar185 = auVar31._0_4_;
      auVar144._0_4_ = fVar185 * auVar32._0_4_;
      auVar144._4_4_ = fVar185 * auVar32._4_4_;
      auVar144._8_4_ = fVar185 * auVar32._8_4_;
      auVar144._12_4_ = fVar185 * auVar32._12_4_;
      auVar32 = vsubps_avx(auVar168,auVar144);
      auVar31 = vrcp14ss_avx512f(auVar64._0_16_,auVar49._0_16_);
      auVar30 = vfnmadd213ss_avx512f(auVar30,auVar31,ZEXT416(0x40000000));
      fVar197 = auVar31._0_4_ * auVar30._0_4_;
      auVar30 = vdpps_avx(auVar40,auVar40,0x7f);
      fVar199 = auVar30._0_4_;
      auVar65._16_16_ = auVar64._16_16_;
      auVar65._0_16_ = auVar64._0_16_;
      auVar50._4_28_ = auVar65._4_28_;
      auVar50._0_4_ = fVar199;
      auVar31 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar50._0_16_);
      fVar185 = auVar31._0_4_;
      fVar185 = fVar185 * 1.5 + fVar199 * -0.5 * fVar185 * fVar185 * fVar185;
      auVar31 = vdpps_avx(auVar40,auVar39,0x7f);
      fVar205 = fVar185 * auVar40._0_4_;
      fVar212 = fVar185 * auVar40._4_4_;
      fVar213 = fVar185 * auVar40._8_4_;
      fVar214 = fVar185 * auVar40._12_4_;
      auVar130._0_4_ = fVar199 * auVar39._0_4_;
      auVar130._4_4_ = fVar199 * auVar39._4_4_;
      auVar130._8_4_ = fVar199 * auVar39._8_4_;
      auVar130._12_4_ = fVar199 * auVar39._12_4_;
      fVar199 = auVar31._0_4_;
      auVar121._0_4_ = fVar199 * auVar40._0_4_;
      auVar121._4_4_ = fVar199 * auVar40._4_4_;
      auVar121._8_4_ = fVar199 * auVar40._8_4_;
      auVar121._12_4_ = fVar199 * auVar40._12_4_;
      auVar41 = vsubps_avx(auVar130,auVar121);
      auVar31 = vrcp14ss_avx512f(auVar64._0_16_,auVar50._0_16_);
      auVar30 = vfnmadd213ss_avx512f(auVar30,auVar31,ZEXT416(0x40000000));
      fVar199 = auVar31._0_4_ * auVar30._0_4_;
      auVar30 = vshufps_avx(auVar45,auVar45,0xff);
      auVar151._0_4_ = fVar184 * auVar30._0_4_;
      auVar151._4_4_ = fVar196 * auVar30._4_4_;
      auVar151._8_4_ = fVar198 * auVar30._8_4_;
      auVar151._12_4_ = fVar200 * auVar30._12_4_;
      local_1e8 = vsubps_avx(auVar45,auVar151);
      auVar31 = vshufps_avx(auVar35,auVar35,0xff);
      auVar131._0_4_ = auVar31._0_4_ * fVar184 + auVar30._0_4_ * fVar204 * auVar32._0_4_ * fVar197;
      auVar131._4_4_ = auVar31._4_4_ * fVar196 + auVar30._4_4_ * fVar204 * auVar32._4_4_ * fVar197;
      auVar131._8_4_ = auVar31._8_4_ * fVar198 + auVar30._8_4_ * fVar204 * auVar32._8_4_ * fVar197;
      auVar131._12_4_ =
           auVar31._12_4_ * fVar200 + auVar30._12_4_ * fVar204 * auVar32._12_4_ * fVar197;
      auVar32 = vsubps_avx(auVar35,auVar131);
      local_1f8._0_4_ = auVar45._0_4_ + auVar151._0_4_;
      local_1f8._4_4_ = auVar45._4_4_ + auVar151._4_4_;
      fStack_1f0 = auVar45._8_4_ + auVar151._8_4_;
      fStack_1ec = auVar45._12_4_ + auVar151._12_4_;
      auVar30 = vshufps_avx(auVar33,auVar33,0xff);
      auVar132._0_4_ = fVar205 * auVar30._0_4_;
      auVar132._4_4_ = fVar212 * auVar30._4_4_;
      auVar132._8_4_ = fVar213 * auVar30._8_4_;
      auVar132._12_4_ = fVar214 * auVar30._12_4_;
      local_208 = vsubps_avx(auVar33,auVar132);
      auVar31 = vshufps_avx(auVar38,auVar38,0xff);
      auVar92._0_4_ = fVar205 * auVar31._0_4_ + auVar30._0_4_ * fVar185 * auVar41._0_4_ * fVar199;
      auVar92._4_4_ = fVar212 * auVar31._4_4_ + auVar30._4_4_ * fVar185 * auVar41._4_4_ * fVar199;
      auVar92._8_4_ = fVar213 * auVar31._8_4_ + auVar30._8_4_ * fVar185 * auVar41._8_4_ * fVar199;
      auVar92._12_4_ =
           fVar214 * auVar31._12_4_ + auVar30._12_4_ * fVar185 * auVar41._12_4_ * fVar199;
      auVar30 = vsubps_avx(auVar38,auVar92);
      _local_218 = vaddps_avx512vl(auVar33,auVar132);
      auVar98._0_4_ = auVar32._0_4_ * 0.33333334;
      auVar98._4_4_ = auVar32._4_4_ * 0.33333334;
      auVar98._8_4_ = auVar32._8_4_ * 0.33333334;
      auVar98._12_4_ = auVar32._12_4_ * 0.33333334;
      local_228 = vaddps_avx512vl(local_1e8,auVar98);
      auVar99._0_4_ = auVar30._0_4_ * 0.33333334;
      auVar99._4_4_ = auVar30._4_4_ * 0.33333334;
      auVar99._8_4_ = auVar30._8_4_ * 0.33333334;
      auVar99._12_4_ = auVar30._12_4_ * 0.33333334;
      local_238 = vsubps_avx512vl(local_208,auVar99);
      auVar83._0_4_ = (fVar201 + auVar131._0_4_) * 0.33333334;
      auVar83._4_4_ = (fVar202 + auVar131._4_4_) * 0.33333334;
      auVar83._8_4_ = (fVar203 + auVar131._8_4_) * 0.33333334;
      auVar83._12_4_ = (fVar91 + auVar131._12_4_) * 0.33333334;
      _local_248 = vaddps_avx512vl(_local_1f8,auVar83);
      auVar84._0_4_ = (fVar108 + auVar92._0_4_) * 0.33333334;
      auVar84._4_4_ = (fVar115 + auVar92._4_4_) * 0.33333334;
      auVar84._8_4_ = (fVar116 + auVar92._8_4_) * 0.33333334;
      auVar84._12_4_ = (fVar117 + auVar92._12_4_) * 0.33333334;
      aVar1 = (ray->super_RayK<1>).org.field_0;
      _local_258 = vsubps_avx512vl(_local_218,auVar84);
      auVar31 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar93._4_4_ = uVar81;
      auVar93._0_4_ = uVar81;
      auVar93._8_4_ = uVar81;
      auVar93._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      aVar2 = (pre->ray_space).vx.field_0;
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      aVar3 = (pre->ray_space).vy.field_0;
      fVar204 = (pre->ray_space).vz.field_0.m128[0];
      fVar185 = (pre->ray_space).vz.field_0.m128[1];
      fVar197 = (pre->ray_space).vz.field_0.m128[2];
      fVar199 = (pre->ray_space).vz.field_0.m128[3];
      auVar85._0_4_ = fVar204 * auVar31._0_4_;
      auVar85._4_4_ = fVar185 * auVar31._4_4_;
      auVar85._8_4_ = fVar197 * auVar31._8_4_;
      auVar85._12_4_ = fVar199 * auVar31._12_4_;
      auVar30 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar3,auVar30);
      auVar40 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar93);
      auVar31 = vsubps_avx512vl(local_228,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar100._4_4_ = uVar81;
      auVar100._0_4_ = uVar81;
      auVar100._8_4_ = uVar81;
      auVar100._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar94._0_4_ = fVar204 * auVar31._0_4_;
      auVar94._4_4_ = fVar185 * auVar31._4_4_;
      auVar94._8_4_ = fVar197 * auVar31._8_4_;
      auVar94._12_4_ = fVar199 * auVar31._12_4_;
      auVar30 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar30);
      auVar39 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar100);
      auVar31 = vsubps_avx512vl(local_238,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar152._4_4_ = uVar81;
      auVar152._0_4_ = uVar81;
      auVar152._8_4_ = uVar81;
      auVar152._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar101._0_4_ = fVar204 * auVar31._0_4_;
      auVar101._4_4_ = fVar185 * auVar31._4_4_;
      auVar101._8_4_ = fVar197 * auVar31._8_4_;
      auVar101._12_4_ = fVar199 * auVar31._12_4_;
      auVar30 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar3,auVar30);
      auVar38 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar152);
      auVar31 = vsubps_avx(local_208,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar162._4_4_ = uVar81;
      auVar162._0_4_ = uVar81;
      auVar162._8_4_ = uVar81;
      auVar162._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar153._0_4_ = fVar204 * auVar31._0_4_;
      auVar153._4_4_ = fVar185 * auVar31._4_4_;
      auVar153._8_4_ = fVar197 * auVar31._8_4_;
      auVar153._12_4_ = fVar199 * auVar31._12_4_;
      auVar30 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar3,auVar30);
      auVar37 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar162);
      auVar31 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar169._4_4_ = uVar81;
      auVar169._0_4_ = uVar81;
      auVar169._8_4_ = uVar81;
      auVar169._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar163._0_4_ = auVar31._0_4_ * fVar204;
      auVar163._4_4_ = auVar31._4_4_ * fVar185;
      auVar163._8_4_ = auVar31._8_4_ * fVar197;
      auVar163._12_4_ = auVar31._12_4_ * fVar199;
      auVar30 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar3,auVar30);
      auVar34 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar169);
      auVar31 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar179._4_4_ = uVar81;
      auVar179._0_4_ = uVar81;
      auVar179._8_4_ = uVar81;
      auVar179._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar170._0_4_ = auVar31._0_4_ * fVar204;
      auVar170._4_4_ = auVar31._4_4_ * fVar185;
      auVar170._8_4_ = auVar31._8_4_ * fVar197;
      auVar170._12_4_ = auVar31._12_4_ * fVar199;
      auVar30 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar3,auVar30);
      auVar45 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar179);
      auVar31 = vsubps_avx512vl(_local_258,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar186._4_4_ = uVar81;
      auVar186._0_4_ = uVar81;
      auVar186._8_4_ = uVar81;
      auVar186._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar180._0_4_ = auVar31._0_4_ * fVar204;
      auVar180._4_4_ = auVar31._4_4_ * fVar185;
      auVar180._8_4_ = auVar31._8_4_ * fVar197;
      auVar180._12_4_ = auVar31._12_4_ * fVar199;
      auVar30 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar30);
      auVar33 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar186);
      auVar31 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
      uVar81 = auVar31._0_4_;
      auVar187._4_4_ = uVar81;
      auVar187._0_4_ = uVar81;
      auVar187._8_4_ = uVar81;
      auVar187._12_4_ = uVar81;
      auVar30 = vshufps_avx(auVar31,auVar31,0x55);
      auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar122._0_4_ = fVar204 * auVar31._0_4_;
      auVar122._4_4_ = fVar185 * auVar31._4_4_;
      auVar122._8_4_ = fVar197 * auVar31._8_4_;
      auVar122._12_4_ = fVar199 * auVar31._12_4_;
      auVar30 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar3,auVar30);
      auVar35 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar187);
      local_298 = vmovlhps_avx(auVar40,auVar34);
      local_1a8 = vmovlhps_avx512f(auVar39,auVar45);
      local_1b8 = vmovlhps_avx512f(auVar38,auVar33);
      _local_d8 = vmovlhps_avx512f(auVar37,auVar35);
      auVar30 = vminps_avx512vl(local_298,local_1a8);
      auVar32 = vmaxps_avx512vl(local_298,local_1a8);
      auVar31 = vminps_avx512vl(local_1b8,_local_d8);
      auVar31 = vminps_avx(auVar30,auVar31);
      auVar30 = vmaxps_avx512vl(local_1b8,_local_d8);
      auVar30 = vmaxps_avx(auVar32,auVar30);
      auVar32 = vshufpd_avx(auVar31,auVar31,3);
      auVar41 = vshufpd_avx(auVar30,auVar30,3);
      auVar31 = vminps_avx(auVar31,auVar32);
      auVar30 = vmaxps_avx(auVar30,auVar41);
      auVar31 = vandps_avx512vl(auVar31,auVar237._0_16_);
      auVar30 = vandps_avx512vl(auVar30,auVar237._0_16_);
      auVar30 = vmaxps_avx(auVar31,auVar30);
      auVar31 = vmovshdup_avx(auVar30);
      auVar30 = vmaxss_avx(auVar31,auVar30);
      fVar204 = auVar30._0_4_ * 9.536743e-07;
      local_1c8 = vmovddup_avx512vl(auVar40);
      auVar240 = ZEXT1664(local_1c8);
      local_1d8 = vmovddup_avx512vl(auVar39);
      auVar241 = ZEXT1664(local_1d8);
      local_2a8._8_8_ = auVar38._0_8_;
      local_2a8._0_8_ = auVar38._0_8_;
      local_2b8._0_8_ = auVar37._0_8_;
      local_2b8._8_8_ = local_2b8._0_8_;
      register0x00001348 = auVar34._0_8_;
      local_2c8 = auVar34._0_8_;
      register0x00001388 = auVar45._0_8_;
      local_2d8 = auVar45._0_8_;
      register0x00001408 = auVar33._0_8_;
      local_2e8 = auVar33._0_8_;
      register0x00001448 = auVar35._0_8_;
      local_2f8 = auVar35._0_8_;
      local_c8 = ZEXT416((uint)fVar204);
      auVar86._4_4_ = fVar204;
      auVar86._0_4_ = fVar204;
      auVar86._8_4_ = fVar204;
      auVar86._12_4_ = fVar204;
      local_78._16_4_ = fVar204;
      local_78._0_16_ = auVar86;
      local_78._20_4_ = fVar204;
      local_78._24_4_ = fVar204;
      local_78._28_4_ = fVar204;
      auVar30 = vxorps_avx512vl(auVar86,auVar233._0_16_);
      local_98 = auVar30._0_4_;
      uStack_94 = local_98;
      uStack_90 = local_98;
      uStack_8c = local_98;
      uStack_88 = local_98;
      uStack_84 = local_98;
      uStack_80 = local_98;
      uStack_7c = local_98;
      local_e8 = vsubps_avx512vl(local_1a8,local_298);
      local_f8 = vsubps_avx512vl(local_1b8,local_1a8);
      local_108 = vsubps_avx512vl(_local_d8,local_1b8);
      local_118 = vsubps_avx(_local_1f8,local_1e8);
      local_128 = vsubps_avx512vl(_local_248,local_228);
      local_138 = vsubps_avx512vl(_local_258,local_238);
      _local_148 = vsubps_avx512vl(_local_218,local_208);
      uVar18 = 0;
      auVar30 = ZEXT816(0x3f80000000000000);
      auVar95 = auVar30;
LAB_01a728d6:
      auVar31 = vshufps_avx(auVar95,auVar95,0x50);
      auVar222._8_4_ = 0x3f800000;
      auVar222._0_8_ = 0x3f8000003f800000;
      auVar222._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._0_16_ = auVar222;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar222,auVar31);
      fVar204 = auVar31._0_4_;
      auVar123._0_4_ = local_2c8._0_4_ * fVar204;
      fVar185 = auVar31._4_4_;
      auVar123._4_4_ = local_2c8._4_4_ * fVar185;
      fVar197 = auVar31._8_4_;
      auVar123._8_4_ = local_2c8._8_4_ * fVar197;
      fVar199 = auVar31._12_4_;
      auVar123._12_4_ = local_2c8._12_4_ * fVar199;
      auVar133._0_4_ = local_2d8._0_4_ * fVar204;
      auVar133._4_4_ = local_2d8._4_4_ * fVar185;
      auVar133._8_4_ = local_2d8._8_4_ * fVar197;
      auVar133._12_4_ = local_2d8._12_4_ * fVar199;
      auVar145._0_4_ = local_2e8._0_4_ * fVar204;
      auVar145._4_4_ = local_2e8._4_4_ * fVar185;
      auVar145._8_4_ = local_2e8._8_4_ * fVar197;
      auVar145._12_4_ = local_2e8._12_4_ * fVar199;
      auVar102._0_4_ = local_2f8._0_4_ * fVar204;
      auVar102._4_4_ = local_2f8._4_4_ * fVar185;
      auVar102._8_4_ = local_2f8._8_4_ * fVar197;
      auVar102._12_4_ = local_2f8._12_4_ * fVar199;
      auVar40 = vfmadd231ps_avx512vl(auVar123,auVar32,auVar240._0_16_);
      auVar39 = vfmadd231ps_avx512vl(auVar133,auVar32,auVar241._0_16_);
      auVar41 = vfmadd231ps_fma(auVar145,auVar32,local_2a8);
      auVar32 = vfmadd231ps_fma(auVar102,local_2b8,auVar32);
      auVar31 = vmovshdup_avx(auVar30);
      fVar185 = auVar30._0_4_;
      fVar204 = (auVar31._0_4_ - fVar185) * 0.04761905;
      auVar63._4_4_ = fVar185;
      auVar63._0_4_ = fVar185;
      auVar63._8_4_ = fVar185;
      auVar63._12_4_ = fVar185;
      auVar63._16_4_ = fVar185;
      auVar63._20_4_ = fVar185;
      auVar63._24_4_ = fVar185;
      auVar63._28_4_ = fVar185;
      auVar58._0_8_ = auVar31._0_8_;
      auVar58._8_8_ = auVar58._0_8_;
      auVar58._16_8_ = auVar58._0_8_;
      auVar58._24_8_ = auVar58._0_8_;
      auVar66 = vsubps_avx(auVar58,auVar63);
      uVar81 = auVar40._0_4_;
      auVar68._4_4_ = uVar81;
      auVar68._0_4_ = uVar81;
      auVar68._8_4_ = uVar81;
      auVar68._12_4_ = uVar81;
      auVar68._16_4_ = uVar81;
      auVar68._20_4_ = uVar81;
      auVar68._24_4_ = uVar81;
      auVar68._28_4_ = uVar81;
      auVar126._8_4_ = 1;
      auVar126._0_8_ = 0x100000001;
      auVar126._12_4_ = 1;
      auVar126._16_4_ = 1;
      auVar126._20_4_ = 1;
      auVar126._24_4_ = 1;
      auVar126._28_4_ = 1;
      auVar65 = ZEXT1632(auVar40);
      auVar64 = vpermps_avx2(auVar126,auVar65);
      auVar49 = vbroadcastss_avx512vl(auVar39);
      auVar59 = ZEXT1632(auVar39);
      auVar50 = vpermps_avx512vl(auVar126,auVar59);
      auVar51 = vbroadcastss_avx512vl(auVar41);
      auVar60 = ZEXT1632(auVar41);
      auVar52 = vpermps_avx512vl(auVar126,auVar60);
      auVar53 = vbroadcastss_avx512vl(auVar32);
      auVar62 = ZEXT1632(auVar32);
      auVar54 = vpermps_avx512vl(auVar126,auVar62);
      auVar140._4_4_ = fVar204;
      auVar140._0_4_ = fVar204;
      auVar140._8_4_ = fVar204;
      auVar140._12_4_ = fVar204;
      auVar140._16_4_ = fVar204;
      auVar140._20_4_ = fVar204;
      auVar140._24_4_ = fVar204;
      auVar140._28_4_ = fVar204;
      auVar61._8_4_ = 2;
      auVar61._0_8_ = 0x200000002;
      auVar61._12_4_ = 2;
      auVar61._16_4_ = 2;
      auVar61._20_4_ = 2;
      auVar61._24_4_ = 2;
      auVar61._28_4_ = 2;
      auVar55 = vpermps_avx512vl(auVar61,auVar65);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar57 = vpermps_avx512vl(auVar56,auVar65);
      auVar58 = vpermps_avx512vl(auVar61,auVar59);
      auVar59 = vpermps_avx512vl(auVar56,auVar59);
      auVar65 = vpermps_avx2(auVar61,auVar60);
      auVar60 = vpermps_avx512vl(auVar56,auVar60);
      auVar61 = vpermps_avx512vl(auVar61,auVar62);
      auVar62 = vpermps_avx512vl(auVar56,auVar62);
      auVar31 = vfmadd132ps_fma(auVar66,auVar63,_DAT_01faff20);
      auVar66 = vsubps_avx(auVar225,ZEXT1632(auVar31));
      auVar56 = vmulps_avx512vl(auVar49,ZEXT1632(auVar31));
      auVar67 = ZEXT1632(auVar31);
      auVar63 = vmulps_avx512vl(auVar50,auVar67);
      auVar32 = vfmadd231ps_fma(auVar56,auVar66,auVar68);
      auVar41 = vfmadd231ps_fma(auVar63,auVar66,auVar64);
      auVar56 = vmulps_avx512vl(auVar51,auVar67);
      auVar63 = vmulps_avx512vl(auVar52,auVar67);
      auVar49 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar49);
      auVar50 = vfmadd231ps_avx512vl(auVar63,auVar66,auVar50);
      auVar56 = vmulps_avx512vl(auVar53,auVar67);
      auVar68 = ZEXT1632(auVar31);
      auVar54 = vmulps_avx512vl(auVar54,auVar68);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar51);
      auVar63 = vfmadd231ps_avx512vl(auVar54,auVar66,auVar52);
      fVar197 = auVar31._0_4_;
      fVar199 = auVar31._4_4_;
      auVar51._4_4_ = fVar199 * auVar49._4_4_;
      auVar51._0_4_ = fVar197 * auVar49._0_4_;
      fVar201 = auVar31._8_4_;
      auVar51._8_4_ = fVar201 * auVar49._8_4_;
      fVar202 = auVar31._12_4_;
      auVar51._12_4_ = fVar202 * auVar49._12_4_;
      auVar51._16_4_ = auVar49._16_4_ * 0.0;
      auVar51._20_4_ = auVar49._20_4_ * 0.0;
      auVar51._24_4_ = auVar49._24_4_ * 0.0;
      auVar51._28_4_ = fVar185;
      auVar52._4_4_ = fVar199 * auVar50._4_4_;
      auVar52._0_4_ = fVar197 * auVar50._0_4_;
      auVar52._8_4_ = fVar201 * auVar50._8_4_;
      auVar52._12_4_ = fVar202 * auVar50._12_4_;
      auVar52._16_4_ = auVar50._16_4_ * 0.0;
      auVar52._20_4_ = auVar50._20_4_ * 0.0;
      auVar52._24_4_ = auVar50._24_4_ * 0.0;
      auVar52._28_4_ = auVar64._28_4_;
      auVar32 = vfmadd231ps_fma(auVar51,auVar66,ZEXT1632(auVar32));
      auVar41 = vfmadd231ps_fma(auVar52,auVar66,ZEXT1632(auVar41));
      auVar67._0_4_ = fVar197 * auVar56._0_4_;
      auVar67._4_4_ = fVar199 * auVar56._4_4_;
      auVar67._8_4_ = fVar201 * auVar56._8_4_;
      auVar67._12_4_ = fVar202 * auVar56._12_4_;
      auVar67._16_4_ = auVar56._16_4_ * 0.0;
      auVar67._20_4_ = auVar56._20_4_ * 0.0;
      auVar67._24_4_ = auVar56._24_4_ * 0.0;
      auVar67._28_4_ = 0;
      auVar54._4_4_ = fVar199 * auVar63._4_4_;
      auVar54._0_4_ = fVar197 * auVar63._0_4_;
      auVar54._8_4_ = fVar201 * auVar63._8_4_;
      auVar54._12_4_ = fVar202 * auVar63._12_4_;
      auVar54._16_4_ = auVar63._16_4_ * 0.0;
      auVar54._20_4_ = auVar63._20_4_ * 0.0;
      auVar54._24_4_ = auVar63._24_4_ * 0.0;
      auVar54._28_4_ = auVar56._28_4_;
      auVar40 = vfmadd231ps_fma(auVar67,auVar66,auVar49);
      auVar39 = vfmadd231ps_fma(auVar54,auVar66,auVar50);
      auVar56._28_4_ = auVar50._28_4_;
      auVar56._0_28_ =
           ZEXT1628(CONCAT412(fVar202 * auVar39._12_4_,
                              CONCAT48(fVar201 * auVar39._8_4_,
                                       CONCAT44(fVar199 * auVar39._4_4_,fVar197 * auVar39._0_4_))));
      auVar38 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar202 * auVar40._12_4_,
                                                   CONCAT48(fVar201 * auVar40._8_4_,
                                                            CONCAT44(fVar199 * auVar40._4_4_,
                                                                     fVar197 * auVar40._0_4_)))),
                                auVar66,ZEXT1632(auVar32));
      auVar37 = vfmadd231ps_fma(auVar56,auVar66,ZEXT1632(auVar41));
      auVar64 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar32));
      auVar49 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar41));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar64 = vmulps_avx512vl(auVar64,auVar50);
      auVar49 = vmulps_avx512vl(auVar49,auVar50);
      auVar69._0_4_ = fVar204 * auVar64._0_4_;
      auVar69._4_4_ = fVar204 * auVar64._4_4_;
      auVar69._8_4_ = fVar204 * auVar64._8_4_;
      auVar69._12_4_ = fVar204 * auVar64._12_4_;
      auVar69._16_4_ = fVar204 * auVar64._16_4_;
      auVar69._20_4_ = fVar204 * auVar64._20_4_;
      auVar69._24_4_ = fVar204 * auVar64._24_4_;
      auVar69._28_4_ = 0;
      auVar64 = vmulps_avx512vl(auVar140,auVar49);
      auVar41 = vxorps_avx512vl(auVar53._0_16_,auVar53._0_16_);
      auVar49 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_01feed00,ZEXT1632(auVar41));
      auVar51 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_01feed00,ZEXT1632(auVar41));
      auVar107._0_4_ = auVar69._0_4_ + auVar38._0_4_;
      auVar107._4_4_ = auVar69._4_4_ + auVar38._4_4_;
      auVar107._8_4_ = auVar69._8_4_ + auVar38._8_4_;
      auVar107._12_4_ = auVar69._12_4_ + auVar38._12_4_;
      auVar107._16_4_ = auVar69._16_4_ + 0.0;
      auVar107._20_4_ = auVar69._20_4_ + 0.0;
      auVar107._24_4_ = auVar69._24_4_ + 0.0;
      auVar107._28_4_ = 0;
      auVar63 = ZEXT1632(auVar41);
      auVar52 = vpermt2ps_avx512vl(auVar69,_DAT_01feed00,auVar63);
      auVar54 = vaddps_avx512vl(ZEXT1632(auVar37),auVar64);
      auVar56 = vpermt2ps_avx512vl(auVar64,_DAT_01feed00,auVar63);
      auVar64 = vsubps_avx(auVar49,auVar52);
      auVar52 = vsubps_avx512vl(auVar51,auVar56);
      auVar56 = vmulps_avx512vl(auVar58,auVar68);
      auVar53 = vmulps_avx512vl(auVar59,auVar68);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar55);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar57);
      auVar55 = vmulps_avx512vl(auVar65,auVar68);
      auVar57 = vmulps_avx512vl(auVar60,auVar68);
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar66,auVar58);
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar66,auVar59);
      auVar58 = vmulps_avx512vl(auVar61,auVar68);
      auVar59 = vmulps_avx512vl(auVar62,auVar68);
      auVar32 = vfmadd231ps_fma(auVar58,auVar66,auVar65);
      auVar65 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar60);
      auVar58 = vmulps_avx512vl(auVar68,auVar55);
      auVar61 = ZEXT1632(auVar31);
      auVar59 = vmulps_avx512vl(auVar61,auVar57);
      auVar56 = vfmadd231ps_avx512vl(auVar58,auVar66,auVar56);
      auVar58 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar53);
      auVar65 = vmulps_avx512vl(auVar61,auVar65);
      auVar55 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar202 * auVar32._12_4_,
                                              CONCAT48(fVar201 * auVar32._8_4_,
                                                       CONCAT44(fVar199 * auVar32._4_4_,
                                                                fVar197 * auVar32._0_4_)))),auVar66,
                           auVar55);
      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar57);
      auVar53._4_4_ = fVar199 * auVar55._4_4_;
      auVar53._0_4_ = fVar197 * auVar55._0_4_;
      auVar53._8_4_ = fVar201 * auVar55._8_4_;
      auVar53._12_4_ = fVar202 * auVar55._12_4_;
      auVar53._16_4_ = auVar55._16_4_ * 0.0;
      auVar53._20_4_ = auVar55._20_4_ * 0.0;
      auVar53._24_4_ = auVar55._24_4_ * 0.0;
      auVar53._28_4_ = auVar60._28_4_;
      auVar57 = vmulps_avx512vl(auVar61,auVar65);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar56);
      auVar59 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar66);
      auVar66 = vsubps_avx512vl(auVar55,auVar56);
      auVar65 = vsubps_avx512vl(auVar65,auVar58);
      auVar66 = vmulps_avx512vl(auVar66,auVar50);
      auVar65 = vmulps_avx512vl(auVar65,auVar50);
      fVar185 = fVar204 * auVar66._0_4_;
      fVar197 = fVar204 * auVar66._4_4_;
      auVar55._4_4_ = fVar197;
      auVar55._0_4_ = fVar185;
      fVar199 = fVar204 * auVar66._8_4_;
      auVar55._8_4_ = fVar199;
      fVar201 = fVar204 * auVar66._12_4_;
      auVar55._12_4_ = fVar201;
      fVar202 = fVar204 * auVar66._16_4_;
      auVar55._16_4_ = fVar202;
      fVar203 = fVar204 * auVar66._20_4_;
      auVar55._20_4_ = fVar203;
      fVar204 = fVar204 * auVar66._24_4_;
      auVar55._24_4_ = fVar204;
      auVar55._28_4_ = auVar66._28_4_;
      auVar65 = vmulps_avx512vl(auVar140,auVar65);
      auVar50 = vpermt2ps_avx512vl(auVar53,_DAT_01feed00,auVar63);
      auVar56 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar63);
      auVar183._0_4_ = auVar53._0_4_ + fVar185;
      auVar183._4_4_ = auVar53._4_4_ + fVar197;
      auVar183._8_4_ = auVar53._8_4_ + fVar199;
      auVar183._12_4_ = auVar53._12_4_ + fVar201;
      auVar183._16_4_ = auVar53._16_4_ + fVar202;
      auVar183._20_4_ = auVar53._20_4_ + fVar203;
      auVar183._24_4_ = auVar53._24_4_ + fVar204;
      auVar183._28_4_ = auVar53._28_4_ + auVar66._28_4_;
      auVar66 = vpermt2ps_avx512vl(auVar55,_DAT_01feed00,ZEXT1632(auVar41));
      auVar55 = vaddps_avx512vl(auVar59,auVar65);
      auVar65 = vpermt2ps_avx512vl(auVar65,_DAT_01feed00,ZEXT1632(auVar41));
      auVar66 = vsubps_avx(auVar50,auVar66);
      auVar65 = vsubps_avx512vl(auVar56,auVar65);
      in_ZMM17 = ZEXT3264(auVar65);
      auVar126 = ZEXT1632(auVar38);
      auVar57 = vsubps_avx512vl(auVar53,auVar126);
      auVar140 = ZEXT1632(auVar37);
      auVar58 = vsubps_avx512vl(auVar59,auVar140);
      auVar60 = vsubps_avx512vl(auVar50,auVar49);
      auVar57 = vaddps_avx512vl(auVar57,auVar60);
      auVar60 = vsubps_avx512vl(auVar56,auVar51);
      auVar58 = vaddps_avx512vl(auVar58,auVar60);
      auVar60 = vmulps_avx512vl(auVar140,auVar57);
      auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar126,auVar58);
      auVar61 = vmulps_avx512vl(auVar54,auVar57);
      auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar107,auVar58);
      auVar62 = vmulps_avx512vl(auVar52,auVar57);
      auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar64,auVar58);
      auVar63 = vmulps_avx512vl(auVar51,auVar57);
      auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar49,auVar58);
      auVar67 = vmulps_avx512vl(auVar59,auVar57);
      auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar53,auVar58);
      auVar68 = vmulps_avx512vl(auVar55,auVar57);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar183,auVar58);
      auVar69 = vmulps_avx512vl(auVar65,auVar57);
      auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar66,auVar58);
      auVar57 = vmulps_avx512vl(auVar56,auVar57);
      auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar50,auVar58);
      auVar58 = vminps_avx512vl(auVar60,auVar61);
      auVar60 = vmaxps_avx512vl(auVar60,auVar61);
      auVar61 = vminps_avx512vl(auVar62,auVar63);
      auVar58 = vminps_avx512vl(auVar58,auVar61);
      auVar61 = vmaxps_avx512vl(auVar62,auVar63);
      auVar60 = vmaxps_avx512vl(auVar60,auVar61);
      auVar61 = vminps_avx512vl(auVar67,auVar68);
      auVar62 = vmaxps_avx512vl(auVar67,auVar68);
      auVar63 = vminps_avx512vl(auVar69,auVar57);
      auVar61 = vminps_avx512vl(auVar61,auVar63);
      auVar58 = vminps_avx512vl(auVar58,auVar61);
      auVar57 = vmaxps_avx512vl(auVar69,auVar57);
      auVar57 = vmaxps_avx512vl(auVar62,auVar57);
      auVar60 = vmaxps_avx512vl(auVar60,auVar57);
      uVar10 = vcmpps_avx512vl(auVar58,local_78,2);
      auVar57._4_4_ = uStack_94;
      auVar57._0_4_ = local_98;
      auVar57._8_4_ = uStack_90;
      auVar57._12_4_ = uStack_8c;
      auVar57._16_4_ = uStack_88;
      auVar57._20_4_ = uStack_84;
      auVar57._24_4_ = uStack_80;
      auVar57._28_4_ = uStack_7c;
      uVar11 = vcmpps_avx512vl(auVar60,auVar57,5);
      bVar16 = (byte)uVar10 & (byte)uVar11 & 0x7f;
      if (bVar16 != 0) {
        auVar58 = vsubps_avx512vl(auVar49,auVar126);
        auVar60 = vsubps_avx512vl(auVar51,auVar140);
        auVar61 = vsubps_avx512vl(auVar50,auVar53);
        auVar58 = vaddps_avx512vl(auVar58,auVar61);
        auVar61 = vsubps_avx512vl(auVar56,auVar59);
        auVar60 = vaddps_avx512vl(auVar60,auVar61);
        auVar61 = vmulps_avx512vl(auVar140,auVar58);
        auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar60,auVar126);
        auVar54 = vmulps_avx512vl(auVar54,auVar58);
        auVar54 = vfnmadd213ps_avx512vl(auVar107,auVar60,auVar54);
        auVar52 = vmulps_avx512vl(auVar52,auVar58);
        auVar52 = vfnmadd213ps_avx512vl(auVar64,auVar60,auVar52);
        auVar64 = vmulps_avx512vl(auVar51,auVar58);
        auVar51 = vfnmadd231ps_avx512vl(auVar64,auVar60,auVar49);
        auVar64 = vmulps_avx512vl(auVar59,auVar58);
        auVar53 = vfnmadd231ps_avx512vl(auVar64,auVar60,auVar53);
        auVar64 = vmulps_avx512vl(auVar55,auVar58);
        auVar55 = vfnmadd213ps_avx512vl(auVar183,auVar60,auVar64);
        auVar64 = vmulps_avx512vl(auVar65,auVar58);
        auVar59 = vfnmadd213ps_avx512vl(auVar66,auVar60,auVar64);
        auVar66 = vmulps_avx512vl(auVar56,auVar58);
        auVar56 = vfnmadd231ps_avx512vl(auVar66,auVar50,auVar60);
        auVar64 = vminps_avx(auVar61,auVar54);
        auVar66 = vmaxps_avx(auVar61,auVar54);
        auVar49 = vminps_avx(auVar52,auVar51);
        auVar49 = vminps_avx(auVar64,auVar49);
        auVar64 = vmaxps_avx(auVar52,auVar51);
        auVar66 = vmaxps_avx(auVar66,auVar64);
        auVar65 = vminps_avx(auVar53,auVar55);
        auVar64 = vmaxps_avx(auVar53,auVar55);
        auVar50 = vminps_avx(auVar59,auVar56);
        auVar65 = vminps_avx(auVar65,auVar50);
        auVar65 = vminps_avx(auVar49,auVar65);
        auVar49 = vmaxps_avx(auVar59,auVar56);
        auVar64 = vmaxps_avx(auVar64,auVar49);
        auVar66 = vmaxps_avx(auVar66,auVar64);
        uVar10 = vcmpps_avx512vl(auVar66,auVar57,5);
        uVar11 = vcmpps_avx512vl(auVar65,local_78,2);
        bVar16 = bVar16 & (byte)uVar10 & (byte)uVar11;
        if (bVar16 != 0) {
          auStack_198[uVar18] = (uint)bVar16;
          uVar10 = vmovlps_avx(auVar30);
          (&uStack_b8)[uVar18] = uVar10;
          uVar24 = vmovlps_avx(auVar95);
          auStack_58[uVar18] = uVar24;
          uVar18 = (ulong)((int)uVar18 + 1);
        }
      }
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar232 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar233 = ZEXT1664(auVar30);
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar234 = ZEXT3264(auVar66);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar235 = ZEXT1664(auVar30);
      auVar236 = ZEXT3264(_DAT_01feed20);
      auVar66 = _DAT_01feed20;
      if ((int)uVar18 != 0) {
        do {
          auVar31 = auVar238._0_16_;
          auVar41 = auVar241._0_16_;
          auVar32 = auVar240._0_16_;
          uVar17 = (int)uVar18 - 1;
          uVar19 = (ulong)uVar17;
          uVar5 = auStack_198[uVar19];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = auStack_58[uVar19];
          uVar24 = 0;
          for (uVar22 = (ulong)uVar5; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
          {
            uVar24 = uVar24 + 1;
          }
          uVar21 = uVar5 - 1 & uVar5;
          bVar27 = uVar21 == 0;
          auStack_198[uVar19] = uVar21;
          if (bVar27) {
            uVar18 = (ulong)uVar17;
          }
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar24;
          auVar30 = vpunpcklqdq_avx(auVar87,ZEXT416((int)uVar24 + 1));
          auVar30 = vcvtqq2ps_avx512vl(auVar30);
          auVar30 = vmulps_avx512vl(auVar30,auVar235._0_16_);
          uVar81 = *(undefined4 *)((long)&uStack_b8 + uVar19 * 8 + 4);
          auVar12._4_4_ = uVar81;
          auVar12._0_4_ = uVar81;
          auVar12._8_4_ = uVar81;
          auVar12._12_4_ = uVar81;
          auVar40 = vmulps_avx512vl(auVar30,auVar12);
          auVar30 = vsubps_avx512vl(auVar31,auVar30);
          uVar81 = *(undefined4 *)(&uStack_b8 + uVar19);
          auVar13._4_4_ = uVar81;
          auVar13._0_4_ = uVar81;
          auVar13._8_4_ = uVar81;
          auVar13._12_4_ = uVar81;
          auVar30 = vfmadd231ps_avx512vl(auVar40,auVar30,auVar13);
          auVar40 = vmovshdup_avx(auVar30);
          fVar204 = auVar40._0_4_ - auVar30._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar204));
          if (uVar5 == 0 || bVar27) goto LAB_01a728d6;
          auVar40 = vshufps_avx(auVar95,auVar95,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar204));
          uVar17 = (uint)uVar18;
          auVar39 = vsubps_avx512vl(auVar31,auVar40);
          fVar185 = auVar40._0_4_;
          auVar134._0_4_ = fVar185 * (float)local_2c8._0_4_;
          fVar197 = auVar40._4_4_;
          auVar134._4_4_ = fVar197 * (float)local_2c8._4_4_;
          fVar199 = auVar40._8_4_;
          auVar134._8_4_ = fVar199 * fStack_2c0;
          fVar201 = auVar40._12_4_;
          auVar134._12_4_ = fVar201 * fStack_2bc;
          auVar146._0_4_ = fVar185 * (float)local_2d8._0_4_;
          auVar146._4_4_ = fVar197 * (float)local_2d8._4_4_;
          auVar146._8_4_ = fVar199 * fStack_2d0;
          auVar146._12_4_ = fVar201 * fStack_2cc;
          auVar154._0_4_ = fVar185 * (float)local_2e8._0_4_;
          auVar154._4_4_ = fVar197 * (float)local_2e8._4_4_;
          auVar154._8_4_ = fVar199 * fStack_2e0;
          auVar154._12_4_ = fVar201 * fStack_2dc;
          auVar111._0_4_ = fVar185 * (float)local_2f8._0_4_;
          auVar111._4_4_ = fVar197 * (float)local_2f8._4_4_;
          auVar111._8_4_ = fVar199 * fStack_2f0;
          auVar111._12_4_ = fVar201 * fStack_2ec;
          auVar38 = vfmadd231ps_avx512vl(auVar134,auVar39,auVar32);
          auVar37 = vfmadd231ps_avx512vl(auVar146,auVar39,auVar41);
          auVar40 = vfmadd231ps_fma(auVar154,auVar39,local_2a8);
          auVar39 = vfmadd231ps_fma(auVar111,auVar39,local_2b8);
          auVar60._16_16_ = auVar38;
          auVar60._0_16_ = auVar38;
          auVar62._16_16_ = auVar37;
          auVar62._0_16_ = auVar37;
          auVar150._16_16_ = auVar40;
          auVar150._0_16_ = auVar40;
          auVar64 = vpermps_avx512vl(auVar236._0_32_,ZEXT1632(auVar30));
          auVar66 = vsubps_avx(auVar62,auVar60);
          auVar38 = vfmadd213ps_fma(auVar66,auVar64,auVar60);
          auVar66 = vsubps_avx(auVar150,auVar62);
          auVar37 = vfmadd213ps_fma(auVar66,auVar64,auVar62);
          auVar40 = vsubps_avx(auVar39,auVar40);
          auVar141._16_16_ = auVar40;
          auVar141._0_16_ = auVar40;
          auVar40 = vfmadd213ps_fma(auVar141,auVar64,auVar150);
          auVar66 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar38));
          auVar39 = vfmadd213ps_fma(auVar66,auVar64,ZEXT1632(auVar38));
          auVar66 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar37));
          auVar40 = vfmadd213ps_fma(auVar66,auVar64,ZEXT1632(auVar37));
          auVar66 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar39));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar66,auVar64);
          auVar66 = vmulps_avx512vl(auVar66,auVar234._0_32_);
          auVar59._16_16_ = auVar66._16_16_;
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar204),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar185 = auVar40._0_4_;
          auVar155._0_8_ =
               CONCAT44(auVar82._4_4_ + fVar185 * auVar66._4_4_,
                        auVar82._0_4_ + fVar185 * auVar66._0_4_);
          auVar155._8_4_ = auVar82._8_4_ + fVar185 * auVar66._8_4_;
          auVar155._12_4_ = auVar82._12_4_ + fVar185 * auVar66._12_4_;
          auVar135._0_4_ = fVar185 * auVar66._16_4_;
          auVar135._4_4_ = fVar185 * auVar66._20_4_;
          auVar135._8_4_ = fVar185 * auVar66._24_4_;
          auVar135._12_4_ = fVar185 * auVar66._28_4_;
          auVar36 = vsubps_avx((undefined1  [16])0x0,auVar135);
          auVar34 = vshufpd_avx(auVar82,auVar82,3);
          auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar40 = vsubps_avx(auVar34,auVar82);
          auVar39 = vsubps_avx(auVar45,(undefined1  [16])0x0);
          auVar171._0_4_ = auVar40._0_4_ + auVar39._0_4_;
          auVar171._4_4_ = auVar40._4_4_ + auVar39._4_4_;
          auVar171._8_4_ = auVar40._8_4_ + auVar39._8_4_;
          auVar171._12_4_ = auVar40._12_4_ + auVar39._12_4_;
          auVar40 = vshufps_avx(auVar82,auVar82,0xb1);
          auVar39 = vshufps_avx(auVar155,auVar155,0xb1);
          auVar38 = vshufps_avx(auVar36,auVar36,0xb1);
          auVar37 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar223._4_4_ = auVar171._0_4_;
          auVar223._0_4_ = auVar171._0_4_;
          auVar223._8_4_ = auVar171._0_4_;
          auVar223._12_4_ = auVar171._0_4_;
          auVar33 = vshufps_avx(auVar171,auVar171,0x55);
          fVar185 = auVar33._0_4_;
          auVar181._0_4_ = auVar40._0_4_ * fVar185;
          fVar197 = auVar33._4_4_;
          auVar181._4_4_ = auVar40._4_4_ * fVar197;
          fVar199 = auVar33._8_4_;
          auVar181._8_4_ = auVar40._8_4_ * fVar199;
          fVar201 = auVar33._12_4_;
          auVar181._12_4_ = auVar40._12_4_ * fVar201;
          auVar188._0_4_ = auVar39._0_4_ * fVar185;
          auVar188._4_4_ = auVar39._4_4_ * fVar197;
          auVar188._8_4_ = auVar39._8_4_ * fVar199;
          auVar188._12_4_ = auVar39._12_4_ * fVar201;
          auVar206._0_4_ = auVar38._0_4_ * fVar185;
          auVar206._4_4_ = auVar38._4_4_ * fVar197;
          auVar206._8_4_ = auVar38._8_4_ * fVar199;
          auVar206._12_4_ = auVar38._12_4_ * fVar201;
          auVar172._0_4_ = auVar37._0_4_ * fVar185;
          auVar172._4_4_ = auVar37._4_4_ * fVar197;
          auVar172._8_4_ = auVar37._8_4_ * fVar199;
          auVar172._12_4_ = auVar37._12_4_ * fVar201;
          auVar40 = vfmadd231ps_fma(auVar181,auVar223,auVar82);
          auVar39 = vfmadd231ps_fma(auVar188,auVar223,auVar155);
          auVar44 = vfmadd231ps_fma(auVar206,auVar223,auVar36);
          auVar48 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar223);
          auVar33 = vshufpd_avx(auVar40,auVar40,1);
          auVar35 = vshufpd_avx(auVar39,auVar39,1);
          auVar42 = vshufpd_avx512vl(auVar44,auVar44,1);
          auVar43 = vshufpd_avx512vl(auVar48,auVar48,1);
          in_ZMM17 = ZEXT1664(auVar43);
          auVar38 = vminss_avx(auVar40,auVar39);
          auVar40 = vmaxss_avx(auVar39,auVar40);
          auVar37 = vminss_avx(auVar44,auVar48);
          auVar39 = vmaxss_avx(auVar48,auVar44);
          auVar38 = vminss_avx(auVar38,auVar37);
          auVar40 = vmaxss_avx(auVar39,auVar40);
          auVar37 = vminss_avx(auVar33,auVar35);
          auVar39 = vmaxss_avx(auVar35,auVar33);
          auVar33 = vminss_avx512f(auVar42,auVar43);
          auVar35 = vmaxss_avx512f(auVar43,auVar42);
          auVar39 = vmaxss_avx(auVar35,auVar39);
          auVar37 = vminss_avx512f(auVar37,auVar33);
          vucomiss_avx512f(auVar38);
          fVar197 = auVar39._0_4_;
          fVar185 = auVar40._0_4_;
          if (uVar17 < 5) {
LAB_01a72fef:
            auVar33 = vucomiss_avx512f(auVar37);
            bVar28 = fVar197 <= -0.0001;
            bVar26 = -0.0001 < fVar185;
            bVar25 = bVar28;
            if (!bVar28) goto LAB_01a73035;
            uVar10 = vcmpps_avx512vl(auVar38,auVar33,5);
            uVar11 = vcmpps_avx512vl(auVar37,auVar33,5);
            bVar16 = (byte)uVar10 & (byte)uVar11 & 1;
            bVar28 = bVar26 && bVar16 == 0;
            bVar25 = bVar26 && bVar16 == 0;
            if (bVar26 && bVar16 == 0) goto LAB_01a73035;
          }
          else {
            bVar28 = fVar197 == -0.0001;
            bVar25 = NAN(fVar197);
            if (fVar197 <= -0.0001) goto LAB_01a72fef;
LAB_01a73035:
            auVar35 = vxorps_avx512vl(auVar32,auVar32);
            vcmpss_avx512f(auVar38,auVar35,1);
            uVar10 = vcmpss_avx512f(auVar40,auVar35,1);
            bVar26 = (bool)((byte)uVar10 & 1);
            auVar59._0_16_ = auVar239._0_16_;
            auVar70._4_28_ = auVar59._4_28_;
            auVar70._0_4_ = (float)((uint)bVar26 * -0x40800000 + (uint)!bVar26 * auVar239._0_4_);
            vucomiss_avx512f(auVar70._0_16_);
            bVar25 = (bool)(!bVar28 | bVar25);
            bVar26 = bVar25 == false;
            auVar72._16_16_ = auVar59._16_16_;
            auVar72._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar71._4_28_ = auVar72._4_28_;
            auVar71._0_4_ = (uint)bVar25 * auVar35._0_4_ + (uint)!bVar25 * 0x7f800000;
            auVar33 = auVar71._0_16_;
            auVar74._16_16_ = auVar59._16_16_;
            auVar74._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar73._4_28_ = auVar74._4_28_;
            auVar73._0_4_ = (uint)bVar25 * auVar35._0_4_ + (uint)!bVar25 * -0x800000;
            auVar32 = auVar73._0_16_;
            auVar41 = vxorps_avx512vl(auVar41,auVar41);
            uVar10 = vcmpss_avx512f(auVar37,auVar35,1);
            bVar28 = (bool)((byte)uVar10 & 1);
            auVar76._16_16_ = auVar59._16_16_;
            auVar76._0_16_ = auVar239._0_16_;
            auVar75._4_28_ = auVar76._4_28_;
            auVar75._0_4_ = (float)((uint)bVar28 * -0x40800000 + (uint)!bVar28 * auVar239._0_4_);
            vucomiss_avx512f(auVar75._0_16_);
            if ((bVar25) || (bVar26)) {
              auVar37 = vucomiss_avx512f(auVar38);
              if ((bVar25) || (bVar26)) {
                auVar35 = vxorps_avx512vl(auVar38,auVar233._0_16_);
                auVar38 = vsubss_avx512f(auVar37,auVar38);
                auVar38 = vdivss_avx512f(auVar35,auVar38);
                auVar37 = vsubss_avx512f(ZEXT416(0x3f800000),auVar38);
                auVar37 = vfmadd213ss_avx512f(auVar37,auVar41,auVar38);
                auVar38 = auVar37;
              }
              else {
                auVar38 = vxorps_avx512vl(auVar37,auVar37);
                vucomiss_avx512f(auVar38);
                auVar37 = ZEXT416(0x3f800000);
                if ((bVar25) || (bVar26)) {
                  auVar37 = SUB6416(ZEXT464(0xff800000),0);
                  auVar38 = SUB6416(ZEXT464(0x7f800000),0);
                }
              }
              auVar33 = vminss_avx512f(auVar33,auVar38);
              auVar32 = vmaxss_avx(auVar37,auVar32);
            }
            auVar239 = ZEXT464(0x3f800000);
            in_ZMM17 = ZEXT1664(local_298);
            uVar10 = vcmpss_avx512f(auVar39,auVar41,1);
            bVar28 = (bool)((byte)uVar10 & 1);
            auVar39 = auVar239._0_16_;
            fVar199 = (float)((uint)bVar28 * -0x40800000 + (uint)!bVar28 * 0x3f800000);
            if ((auVar70._0_4_ != fVar199) || (NAN(auVar70._0_4_) || NAN(fVar199))) {
              if ((fVar197 != fVar185) || (NAN(fVar197) || NAN(fVar185))) {
                auVar40 = vxorps_avx512vl(auVar40,auVar233._0_16_);
                auVar173._0_4_ = auVar40._0_4_ / (fVar197 - fVar185);
                auVar173._4_12_ = auVar40._4_12_;
                auVar40 = vsubss_avx512f(auVar39,auVar173);
                auVar40 = vfmadd213ss_avx512f(auVar40,auVar41,auVar173);
                auVar38 = auVar40;
              }
              else if ((fVar185 != 0.0) ||
                      (auVar40 = auVar39, auVar38 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar185))) {
                auVar40 = SUB6416(ZEXT464(0xff800000),0);
                auVar38 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar33 = vminss_avx(auVar33,auVar38);
              auVar32 = vmaxss_avx(auVar40,auVar32);
            }
            bVar28 = auVar75._0_4_ != fVar199;
            auVar40 = vminss_avx512f(auVar33,auVar39);
            auVar78._16_16_ = auVar59._16_16_;
            auVar78._0_16_ = auVar33;
            auVar77._4_28_ = auVar78._4_28_;
            auVar77._0_4_ = (uint)bVar28 * auVar40._0_4_ + (uint)!bVar28 * auVar33._0_4_;
            auVar40 = vmaxss_avx512f(auVar39,auVar32);
            auVar80._16_16_ = auVar59._16_16_;
            auVar80._0_16_ = auVar32;
            auVar79._4_28_ = auVar80._4_28_;
            auVar79._0_4_ = (uint)bVar28 * auVar40._0_4_ + (uint)!bVar28 * auVar32._0_4_;
            auVar32 = vmaxss_avx512f(auVar41,auVar77._0_16_);
            auVar40 = vminss_avx512f(auVar79._0_16_,auVar39);
            if (auVar32._0_4_ <= auVar40._0_4_) {
              auVar37 = vmaxss_avx512f(auVar41,ZEXT416((uint)(auVar32._0_4_ + -0.1)));
              auVar44 = vminss_avx512f(ZEXT416((uint)(auVar40._0_4_ + 0.1)),auVar39);
              auVar112._0_8_ = auVar82._0_8_;
              auVar112._8_8_ = auVar112._0_8_;
              auVar189._8_8_ = auVar155._0_8_;
              auVar189._0_8_ = auVar155._0_8_;
              auVar207._8_8_ = auVar36._0_8_;
              auVar207._0_8_ = auVar36._0_8_;
              auVar32 = vshufpd_avx(auVar155,auVar155,3);
              auVar40 = vshufpd_avx(auVar36,auVar36,3);
              auVar38 = vshufps_avx(auVar37,auVar44,0);
              auVar35 = vsubps_avx512vl(auVar31,auVar38);
              fVar185 = auVar38._0_4_;
              auVar147._0_4_ = fVar185 * auVar34._0_4_;
              fVar197 = auVar38._4_4_;
              auVar147._4_4_ = fVar197 * auVar34._4_4_;
              fVar199 = auVar38._8_4_;
              auVar147._8_4_ = fVar199 * auVar34._8_4_;
              fVar201 = auVar38._12_4_;
              auVar147._12_4_ = fVar201 * auVar34._12_4_;
              auVar156._0_4_ = fVar185 * auVar32._0_4_;
              auVar156._4_4_ = fVar197 * auVar32._4_4_;
              auVar156._8_4_ = fVar199 * auVar32._8_4_;
              auVar156._12_4_ = fVar201 * auVar32._12_4_;
              auVar227._0_4_ = auVar40._0_4_ * fVar185;
              auVar227._4_4_ = auVar40._4_4_ * fVar197;
              auVar227._8_4_ = auVar40._8_4_ * fVar199;
              auVar227._12_4_ = auVar40._12_4_ * fVar201;
              auVar136._0_4_ = fVar185 * auVar45._0_4_;
              auVar136._4_4_ = fVar197 * auVar45._4_4_;
              auVar136._8_4_ = fVar199 * auVar45._8_4_;
              auVar136._12_4_ = fVar201 * auVar45._12_4_;
              auVar34 = vfmadd231ps_fma(auVar147,auVar35,auVar112);
              auVar45 = vfmadd231ps_fma(auVar156,auVar35,auVar189);
              auVar33 = vfmadd231ps_fma(auVar227,auVar35,auVar207);
              auVar35 = vfmadd231ps_fma(auVar136,auVar35,ZEXT816(0));
              auVar40 = vsubss_avx512f(auVar39,auVar37);
              auVar32 = vmovshdup_avx(auVar95);
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar37._0_4_)),auVar95,
                                        auVar40);
              auVar40 = vsubss_avx512f(auVar39,auVar44);
              auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar44._0_4_)),auVar95,
                                        auVar40);
              auVar36 = vdivss_avx512f(auVar39,ZEXT416((uint)fVar204));
              auVar32 = vsubps_avx(auVar45,auVar34);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar38 = vmulps_avx512vl(auVar32,auVar44);
              auVar32 = vsubps_avx(auVar33,auVar45);
              auVar37 = vmulps_avx512vl(auVar32,auVar44);
              auVar32 = vsubps_avx(auVar35,auVar33);
              auVar32 = vmulps_avx512vl(auVar32,auVar44);
              auVar40 = vminps_avx(auVar37,auVar32);
              auVar32 = vmaxps_avx(auVar37,auVar32);
              auVar40 = vminps_avx(auVar38,auVar40);
              auVar32 = vmaxps_avx(auVar38,auVar32);
              auVar38 = vshufpd_avx(auVar40,auVar40,3);
              auVar37 = vshufpd_avx(auVar32,auVar32,3);
              auVar40 = vminps_avx(auVar40,auVar38);
              auVar32 = vmaxps_avx(auVar32,auVar37);
              fVar204 = auVar36._0_4_;
              auVar174._0_4_ = auVar40._0_4_ * fVar204;
              auVar174._4_4_ = auVar40._4_4_ * fVar204;
              auVar174._8_4_ = auVar40._8_4_ * fVar204;
              auVar174._12_4_ = auVar40._12_4_ * fVar204;
              auVar164._0_4_ = fVar204 * auVar32._0_4_;
              auVar164._4_4_ = fVar204 * auVar32._4_4_;
              auVar164._8_4_ = fVar204 * auVar32._8_4_;
              auVar164._12_4_ = fVar204 * auVar32._12_4_;
              auVar36 = vdivss_avx512f(auVar39,ZEXT416((uint)(auVar42._0_4_ - auVar82._0_4_)));
              auVar32 = vshufpd_avx(auVar34,auVar34,3);
              auVar40 = vshufpd_avx(auVar45,auVar45,3);
              auVar38 = vshufpd_avx(auVar33,auVar33,3);
              auVar37 = vshufpd_avx(auVar35,auVar35,3);
              auVar32 = vsubps_avx(auVar32,auVar34);
              auVar34 = vsubps_avx(auVar40,auVar45);
              auVar45 = vsubps_avx(auVar38,auVar33);
              auVar37 = vsubps_avx(auVar37,auVar35);
              auVar40 = vminps_avx(auVar32,auVar34);
              auVar32 = vmaxps_avx(auVar32,auVar34);
              auVar38 = vminps_avx(auVar45,auVar37);
              auVar38 = vminps_avx(auVar40,auVar38);
              auVar40 = vmaxps_avx(auVar45,auVar37);
              auVar32 = vmaxps_avx(auVar32,auVar40);
              fVar204 = auVar36._0_4_;
              auVar208._0_4_ = fVar204 * auVar38._0_4_;
              auVar208._4_4_ = fVar204 * auVar38._4_4_;
              auVar208._8_4_ = fVar204 * auVar38._8_4_;
              auVar208._12_4_ = fVar204 * auVar38._12_4_;
              auVar190._0_4_ = fVar204 * auVar32._0_4_;
              auVar190._4_4_ = fVar204 * auVar32._4_4_;
              auVar190._8_4_ = fVar204 * auVar32._8_4_;
              auVar190._12_4_ = fVar204 * auVar32._12_4_;
              auVar37 = vinsertps_avx(auVar30,auVar82,0x10);
              auVar43 = vpermt2ps_avx512vl(auVar30,_DAT_01feecd0,auVar42);
              auVar96._0_4_ = auVar37._0_4_ + auVar43._0_4_;
              auVar96._4_4_ = auVar37._4_4_ + auVar43._4_4_;
              auVar96._8_4_ = auVar37._8_4_ + auVar43._8_4_;
              auVar96._12_4_ = auVar37._12_4_ + auVar43._12_4_;
              auVar36 = vmulps_avx512vl(auVar96,auVar232._0_16_);
              auVar40 = vshufps_avx(auVar36,auVar36,0x54);
              uVar81 = auVar36._0_4_;
              auVar103._4_4_ = uVar81;
              auVar103._0_4_ = uVar81;
              auVar103._8_4_ = uVar81;
              auVar103._12_4_ = uVar81;
              auVar45 = vfmadd213ps_avx512vl(local_e8,auVar103,local_298);
              auVar38 = vfmadd213ps_fma(local_f8,auVar103,local_1a8);
              auVar34 = vfmadd213ps_fma(local_108,auVar103,local_1b8);
              auVar32 = vsubps_avx(auVar38,auVar45);
              auVar45 = vfmadd213ps_fma(auVar32,auVar103,auVar45);
              auVar32 = vsubps_avx(auVar34,auVar38);
              auVar32 = vfmadd213ps_fma(auVar32,auVar103,auVar38);
              auVar32 = vsubps_avx(auVar32,auVar45);
              auVar38 = vfmadd231ps_fma(auVar45,auVar32,auVar103);
              auVar33 = vmulps_avx512vl(auVar32,auVar44);
              auVar218._8_8_ = auVar38._0_8_;
              auVar218._0_8_ = auVar38._0_8_;
              auVar32 = vshufpd_avx(auVar38,auVar38,3);
              auVar38 = vshufps_avx(auVar36,auVar36,0x55);
              auVar34 = vsubps_avx(auVar32,auVar218);
              auVar45 = vfmadd231ps_fma(auVar218,auVar38,auVar34);
              auVar228._8_8_ = auVar33._0_8_;
              auVar228._0_8_ = auVar33._0_8_;
              auVar32 = vshufpd_avx(auVar33,auVar33,3);
              auVar32 = vsubps_avx512vl(auVar32,auVar228);
              auVar32 = vfmadd213ps_avx512vl(auVar32,auVar38,auVar228);
              auVar104._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
              auVar104._8_4_ = auVar34._8_4_ ^ 0x80000000;
              auVar104._12_4_ = auVar34._12_4_ ^ 0x80000000;
              auVar38 = vmovshdup_avx512vl(auVar32);
              auVar229._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar38._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar38._12_4_ ^ 0x80000000;
              auVar33 = vmovshdup_avx512vl(auVar34);
              auVar35 = vpermt2ps_avx512vl(auVar229,ZEXT416(5),auVar34);
              auVar38 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar34._0_4_)),auVar32,
                                            auVar33);
              auVar34 = vpermt2ps_avx512vl(auVar32,SUB6416(ZEXT464(4),0),auVar104);
              auVar137._0_4_ = auVar38._0_4_;
              auVar137._4_4_ = auVar137._0_4_;
              auVar137._8_4_ = auVar137._0_4_;
              auVar137._12_4_ = auVar137._0_4_;
              auVar32 = vdivps_avx(auVar35,auVar137);
              auVar46 = vdivps_avx512vl(auVar34,auVar137);
              fVar204 = auVar45._0_4_;
              auVar38 = vshufps_avx(auVar45,auVar45,0x55);
              auVar219._0_4_ = fVar204 * auVar32._0_4_ + auVar38._0_4_ * auVar46._0_4_;
              auVar219._4_4_ = fVar204 * auVar32._4_4_ + auVar38._4_4_ * auVar46._4_4_;
              auVar219._8_4_ = fVar204 * auVar32._8_4_ + auVar38._8_4_ * auVar46._8_4_;
              auVar219._12_4_ = fVar204 * auVar32._12_4_ + auVar38._12_4_ * auVar46._12_4_;
              auVar44 = vsubps_avx(auVar40,auVar219);
              auVar38 = vmovshdup_avx(auVar32);
              auVar40 = vinsertps_avx(auVar174,auVar208,0x1c);
              auVar230._0_4_ = auVar38._0_4_ * auVar40._0_4_;
              auVar230._4_4_ = auVar38._4_4_ * auVar40._4_4_;
              auVar230._8_4_ = auVar38._8_4_ * auVar40._8_4_;
              auVar230._12_4_ = auVar38._12_4_ * auVar40._12_4_;
              auVar48 = vinsertps_avx512f(auVar164,auVar190,0x1c);
              auVar38 = vmulps_avx512vl(auVar38,auVar48);
              auVar35 = vminps_avx512vl(auVar230,auVar38);
              auVar45 = vmaxps_avx(auVar38,auVar230);
              auVar33 = vmovshdup_avx(auVar46);
              auVar38 = vinsertps_avx(auVar208,auVar174,0x4c);
              auVar209._0_4_ = auVar33._0_4_ * auVar38._0_4_;
              auVar209._4_4_ = auVar33._4_4_ * auVar38._4_4_;
              auVar209._8_4_ = auVar33._8_4_ * auVar38._8_4_;
              auVar209._12_4_ = auVar33._12_4_ * auVar38._12_4_;
              auVar34 = vinsertps_avx(auVar190,auVar164,0x4c);
              auVar191._0_4_ = auVar33._0_4_ * auVar34._0_4_;
              auVar191._4_4_ = auVar33._4_4_ * auVar34._4_4_;
              auVar191._8_4_ = auVar33._8_4_ * auVar34._8_4_;
              auVar191._12_4_ = auVar33._12_4_ * auVar34._12_4_;
              auVar33 = vminps_avx(auVar209,auVar191);
              auVar35 = vaddps_avx512vl(auVar35,auVar33);
              auVar33 = vmaxps_avx(auVar191,auVar209);
              auVar192._0_4_ = auVar45._0_4_ + auVar33._0_4_;
              auVar192._4_4_ = auVar45._4_4_ + auVar33._4_4_;
              auVar192._8_4_ = auVar45._8_4_ + auVar33._8_4_;
              auVar192._12_4_ = auVar45._12_4_ + auVar33._12_4_;
              auVar210._8_8_ = 0x3f80000000000000;
              auVar210._0_8_ = 0x3f80000000000000;
              auVar45 = vsubps_avx(auVar210,auVar192);
              auVar33 = vsubps_avx(auVar210,auVar35);
              auVar35 = vsubps_avx(auVar37,auVar36);
              auVar36 = vsubps_avx(auVar43,auVar36);
              fVar201 = auVar35._0_4_;
              auVar231._0_4_ = fVar201 * auVar45._0_4_;
              fVar202 = auVar35._4_4_;
              auVar231._4_4_ = fVar202 * auVar45._4_4_;
              fVar203 = auVar35._8_4_;
              auVar231._8_4_ = fVar203 * auVar45._8_4_;
              fVar91 = auVar35._12_4_;
              auVar231._12_4_ = fVar91 * auVar45._12_4_;
              auVar47 = vbroadcastss_avx512vl(auVar32);
              auVar40 = vmulps_avx512vl(auVar47,auVar40);
              auVar48 = vmulps_avx512vl(auVar47,auVar48);
              auVar47 = vminps_avx512vl(auVar40,auVar48);
              auVar48 = vmaxps_avx512vl(auVar48,auVar40);
              auVar40 = vbroadcastss_avx512vl(auVar46);
              auVar38 = vmulps_avx512vl(auVar40,auVar38);
              auVar40 = vmulps_avx512vl(auVar40,auVar34);
              auVar34 = vminps_avx512vl(auVar38,auVar40);
              auVar34 = vaddps_avx512vl(auVar47,auVar34);
              auVar35 = vmulps_avx512vl(auVar35,auVar33);
              in_ZMM17 = ZEXT1664(auVar35);
              fVar204 = auVar36._0_4_;
              auVar193._0_4_ = fVar204 * auVar45._0_4_;
              fVar185 = auVar36._4_4_;
              auVar193._4_4_ = fVar185 * auVar45._4_4_;
              fVar197 = auVar36._8_4_;
              auVar193._8_4_ = fVar197 * auVar45._8_4_;
              fVar199 = auVar36._12_4_;
              auVar193._12_4_ = fVar199 * auVar45._12_4_;
              auVar211._0_4_ = fVar204 * auVar33._0_4_;
              auVar211._4_4_ = fVar185 * auVar33._4_4_;
              auVar211._8_4_ = fVar197 * auVar33._8_4_;
              auVar211._12_4_ = fVar199 * auVar33._12_4_;
              auVar40 = vmaxps_avx(auVar40,auVar38);
              auVar165._0_4_ = auVar48._0_4_ + auVar40._0_4_;
              auVar165._4_4_ = auVar48._4_4_ + auVar40._4_4_;
              auVar165._8_4_ = auVar48._8_4_ + auVar40._8_4_;
              auVar165._12_4_ = auVar48._12_4_ + auVar40._12_4_;
              auVar175._8_8_ = 0x3f800000;
              auVar175._0_8_ = 0x3f800000;
              auVar40 = vsubps_avx(auVar175,auVar165);
              auVar38 = vsubps_avx512vl(auVar175,auVar34);
              auVar224._0_4_ = fVar201 * auVar40._0_4_;
              auVar224._4_4_ = fVar202 * auVar40._4_4_;
              auVar224._8_4_ = fVar203 * auVar40._8_4_;
              auVar224._12_4_ = fVar91 * auVar40._12_4_;
              auVar220._0_4_ = fVar201 * auVar38._0_4_;
              auVar220._4_4_ = fVar202 * auVar38._4_4_;
              auVar220._8_4_ = fVar203 * auVar38._8_4_;
              auVar220._12_4_ = fVar91 * auVar38._12_4_;
              auVar166._0_4_ = fVar204 * auVar40._0_4_;
              auVar166._4_4_ = fVar185 * auVar40._4_4_;
              auVar166._8_4_ = fVar197 * auVar40._8_4_;
              auVar166._12_4_ = fVar199 * auVar40._12_4_;
              auVar176._0_4_ = fVar204 * auVar38._0_4_;
              auVar176._4_4_ = fVar185 * auVar38._4_4_;
              auVar176._8_4_ = fVar197 * auVar38._8_4_;
              auVar176._12_4_ = fVar199 * auVar38._12_4_;
              auVar40 = vminps_avx(auVar224,auVar220);
              auVar38 = vminps_avx512vl(auVar166,auVar176);
              auVar34 = vminps_avx512vl(auVar40,auVar38);
              auVar40 = vmaxps_avx(auVar220,auVar224);
              auVar38 = vmaxps_avx(auVar176,auVar166);
              auVar38 = vmaxps_avx(auVar38,auVar40);
              auVar45 = vminps_avx512vl(auVar231,auVar35);
              auVar40 = vminps_avx(auVar193,auVar211);
              auVar40 = vminps_avx(auVar45,auVar40);
              auVar40 = vhaddps_avx(auVar34,auVar40);
              auVar45 = vmaxps_avx512vl(auVar35,auVar231);
              auVar34 = vmaxps_avx(auVar211,auVar193);
              auVar34 = vmaxps_avx(auVar34,auVar45);
              auVar38 = vhaddps_avx(auVar38,auVar34);
              auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
              auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
              auVar167._0_4_ = auVar40._0_4_ + auVar44._0_4_;
              auVar167._4_4_ = auVar40._4_4_ + auVar44._4_4_;
              auVar167._8_4_ = auVar40._8_4_ + auVar44._8_4_;
              auVar167._12_4_ = auVar40._12_4_ + auVar44._12_4_;
              auVar177._0_4_ = auVar38._0_4_ + auVar44._0_4_;
              auVar177._4_4_ = auVar38._4_4_ + auVar44._4_4_;
              auVar177._8_4_ = auVar38._8_4_ + auVar44._8_4_;
              auVar177._12_4_ = auVar38._12_4_ + auVar44._12_4_;
              auVar40 = vmaxps_avx(auVar37,auVar167);
              auVar38 = vminps_avx(auVar177,auVar43);
              uVar24 = vcmpps_avx512vl(auVar38,auVar40,1);
              if ((uVar24 & 3) == 0) {
                uVar24 = vcmpps_avx512vl(auVar177,auVar43,1);
                uVar10 = vcmpps_avx512vl(auVar30,auVar167,1);
                if (((ushort)uVar10 & (ushort)uVar24 & 1) == 0) {
                  bVar16 = 0;
                }
                else {
                  auVar40 = vmovshdup_avx(auVar167);
                  bVar16 = auVar82._0_4_ < auVar40._0_4_ & (byte)(uVar24 >> 1) & 0x7f;
                }
                if (((3 < uVar17 || uVar5 != 0 && !bVar27) | bVar16) != 1) {
                  auVar95 = vinsertps_avx(auVar82,auVar42,0x10);
                  auVar240 = ZEXT1664(local_1c8);
                  auVar241 = ZEXT1664(local_1d8);
                  goto LAB_01a728d6;
                }
                lVar20 = 200;
                do {
                  auVar30 = vsubss_avx512f(auVar39,auVar44);
                  fVar197 = auVar30._0_4_;
                  fVar204 = fVar197 * fVar197 * fVar197;
                  auVar30 = vmulss_avx512f(auVar44,ZEXT416(0x40400000));
                  fVar185 = auVar30._0_4_ * fVar197 * fVar197;
                  fVar199 = auVar44._0_4_;
                  auVar30 = vmulss_avx512f(ZEXT416((uint)(fVar199 * fVar199)),ZEXT416(0x40400000));
                  fVar197 = fVar197 * auVar30._0_4_;
                  auVar124._4_4_ = fVar204;
                  auVar124._0_4_ = fVar204;
                  auVar124._8_4_ = fVar204;
                  auVar124._12_4_ = fVar204;
                  auVar113._4_4_ = fVar185;
                  auVar113._0_4_ = fVar185;
                  auVar113._8_4_ = fVar185;
                  auVar113._12_4_ = fVar185;
                  auVar88._4_4_ = fVar197;
                  auVar88._0_4_ = fVar197;
                  auVar88._8_4_ = fVar197;
                  auVar88._12_4_ = fVar197;
                  fVar199 = fVar199 * fVar199 * fVar199;
                  auVar148._0_4_ = (float)local_d8._0_4_ * fVar199;
                  auVar148._4_4_ = (float)local_d8._4_4_ * fVar199;
                  auVar148._8_4_ = fStack_d0 * fVar199;
                  auVar148._12_4_ = fStack_cc * fVar199;
                  auVar30 = vfmadd231ps_fma(auVar148,local_1b8,auVar88);
                  auVar30 = vfmadd231ps_fma(auVar30,local_1a8,auVar113);
                  auVar30 = vfmadd231ps_fma(auVar30,local_298,auVar124);
                  auVar89._8_8_ = auVar30._0_8_;
                  auVar89._0_8_ = auVar30._0_8_;
                  auVar30 = vshufpd_avx(auVar30,auVar30,3);
                  auVar40 = vshufps_avx(auVar44,auVar44,0x55);
                  auVar30 = vsubps_avx(auVar30,auVar89);
                  auVar40 = vfmadd213ps_fma(auVar30,auVar40,auVar89);
                  fVar204 = auVar40._0_4_;
                  auVar30 = vshufps_avx(auVar40,auVar40,0x55);
                  auVar90._0_4_ = auVar32._0_4_ * fVar204 + auVar46._0_4_ * auVar30._0_4_;
                  auVar90._4_4_ = auVar32._4_4_ * fVar204 + auVar46._4_4_ * auVar30._4_4_;
                  auVar90._8_4_ = auVar32._8_4_ * fVar204 + auVar46._8_4_ * auVar30._8_4_;
                  auVar90._12_4_ = auVar32._12_4_ * fVar204 + auVar46._12_4_ * auVar30._12_4_;
                  auVar44 = vsubps_avx(auVar44,auVar90);
                  auVar30 = vandps_avx512vl(auVar40,auVar237._0_16_);
                  auVar40 = vprolq_avx512vl(auVar30,0x20);
                  auVar30 = vmaxss_avx(auVar40,auVar30);
                  bVar27 = auVar30._0_4_ <= (float)local_c8._0_4_;
                  if (auVar30._0_4_ < (float)local_c8._0_4_) {
                    auVar30 = vucomiss_avx512f(auVar41);
                    if (bVar27) {
                      auVar32 = vucomiss_avx512f(auVar30);
                      auVar239 = ZEXT1664(auVar32);
                      if (bVar27) {
                        vmovshdup_avx(auVar30);
                        auVar32 = vucomiss_avx512f(auVar41);
                        if (bVar27) {
                          auVar41 = vucomiss_avx512f(auVar32);
                          auVar239 = ZEXT1664(auVar41);
                          if (bVar27) {
                            auVar40 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar35 = vinsertps_avx(auVar40,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar1 = (ray->super_RayK<1>).org.field_0;
                            auVar40 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                            auVar40 = vdpps_avx(auVar40,auVar35,0x7f);
                            auVar39 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                            auVar39 = vdpps_avx(auVar39,auVar35,0x7f);
                            auVar38 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                            auVar38 = vdpps_avx(auVar38,auVar35,0x7f);
                            auVar37 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                            auVar37 = vdpps_avx(auVar37,auVar35,0x7f);
                            auVar34 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
                            auVar34 = vdpps_avx(auVar34,auVar35,0x7f);
                            auVar45 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                            auVar45 = vdpps_avx(auVar45,auVar35,0x7f);
                            auVar33 = vsubps_avx(_local_258,(undefined1  [16])aVar1);
                            auVar33 = vdpps_avx(auVar33,auVar35,0x7f);
                            auVar36 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                            auVar35 = vdpps_avx(auVar36,auVar35,0x7f);
                            auVar36 = vsubss_avx512f(auVar41,auVar32);
                            fVar204 = auVar32._0_4_;
                            auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * fVar204)),
                                                      auVar36,auVar40);
                            auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar204)),
                                                      auVar36,auVar39);
                            auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar33._0_4_ * fVar204)),
                                                      auVar36,auVar38);
                            auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar35._0_4_)),
                                                      auVar36,auVar37);
                            auVar41 = vsubss_avx512f(auVar41,auVar30);
                            auVar149._0_4_ = auVar41._0_4_;
                            fVar185 = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_;
                            auVar41 = vmulss_avx512f(auVar30,ZEXT416(0x40400000));
                            fVar197 = auVar41._0_4_ * auVar149._0_4_ * auVar149._0_4_;
                            fVar204 = auVar30._0_4_;
                            auVar138._0_4_ = fVar204 * fVar204;
                            auVar138._4_4_ = auVar30._4_4_ * auVar30._4_4_;
                            auVar138._8_4_ = auVar30._8_4_ * auVar30._8_4_;
                            auVar138._12_4_ = auVar30._12_4_ * auVar30._12_4_;
                            auVar41 = vmulss_avx512f(auVar138,ZEXT416(0x40400000));
                            fVar199 = auVar149._0_4_ * auVar41._0_4_;
                            fVar202 = fVar204 * auVar138._0_4_;
                            auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar38._0_4_)),
                                                      ZEXT416((uint)fVar199),auVar39);
                            auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar197),auVar40);
                            auVar32 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar185),auVar32);
                            fVar201 = auVar32._0_4_;
                            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar201) &&
                               (fVar203 = (ray->super_RayK<1>).tfar, fVar201 <= fVar203)) {
                              auVar32 = vshufps_avx(auVar30,auVar30,0x55);
                              auVar40 = vsubps_avx512vl(auVar31,auVar32);
                              fVar91 = auVar32._0_4_;
                              auVar178._0_4_ = fVar91 * (float)local_1f8._0_4_;
                              fVar108 = auVar32._4_4_;
                              auVar178._4_4_ = fVar108 * (float)local_1f8._4_4_;
                              fVar115 = auVar32._8_4_;
                              auVar178._8_4_ = fVar115 * fStack_1f0;
                              fVar116 = auVar32._12_4_;
                              auVar178._12_4_ = fVar116 * fStack_1ec;
                              auVar182._0_4_ = fVar91 * (float)local_248._0_4_;
                              auVar182._4_4_ = fVar108 * (float)local_248._4_4_;
                              auVar182._8_4_ = fVar115 * fStack_240;
                              auVar182._12_4_ = fVar116 * fStack_23c;
                              auVar194._0_4_ = fVar91 * (float)local_258._0_4_;
                              auVar194._4_4_ = fVar108 * (float)local_258._4_4_;
                              auVar194._8_4_ = fVar115 * fStack_250;
                              auVar194._12_4_ = fVar116 * fStack_24c;
                              auVar157._0_4_ = fVar91 * (float)local_218._0_4_;
                              auVar157._4_4_ = fVar108 * (float)local_218._4_4_;
                              auVar157._8_4_ = fVar115 * fStack_210;
                              auVar157._12_4_ = fVar116 * fStack_20c;
                              auVar31 = vfmadd231ps_fma(auVar178,auVar40,local_1e8);
                              auVar32 = vfmadd231ps_fma(auVar182,auVar40,local_228);
                              auVar41 = vfmadd231ps_fma(auVar194,auVar40,local_238);
                              auVar40 = vfmadd231ps_fma(auVar157,auVar40,local_208);
                              auVar31 = vsubps_avx(auVar32,auVar31);
                              auVar32 = vsubps_avx(auVar41,auVar32);
                              auVar41 = vsubps_avx(auVar40,auVar41);
                              auVar195._0_4_ = fVar204 * auVar32._0_4_;
                              auVar195._4_4_ = fVar204 * auVar32._4_4_;
                              auVar195._8_4_ = fVar204 * auVar32._8_4_;
                              auVar195._12_4_ = fVar204 * auVar32._12_4_;
                              auVar149._4_4_ = auVar149._0_4_;
                              auVar149._8_4_ = auVar149._0_4_;
                              auVar149._12_4_ = auVar149._0_4_;
                              auVar31 = vfmadd231ps_fma(auVar195,auVar149,auVar31);
                              auVar158._0_4_ = fVar204 * auVar41._0_4_;
                              auVar158._4_4_ = fVar204 * auVar41._4_4_;
                              auVar158._8_4_ = fVar204 * auVar41._8_4_;
                              auVar158._12_4_ = fVar204 * auVar41._12_4_;
                              auVar32 = vfmadd231ps_fma(auVar158,auVar149,auVar32);
                              auVar159._0_4_ = fVar204 * auVar32._0_4_;
                              auVar159._4_4_ = fVar204 * auVar32._4_4_;
                              auVar159._8_4_ = fVar204 * auVar32._8_4_;
                              auVar159._12_4_ = fVar204 * auVar32._12_4_;
                              auVar31 = vfmadd231ps_fma(auVar159,auVar149,auVar31);
                              auVar15._8_4_ = 0x40400000;
                              auVar15._0_8_ = 0x4040000040400000;
                              auVar15._12_4_ = 0x40400000;
                              auVar31 = vmulps_avx512vl(auVar31,auVar15);
                              pGVar6 = (context->scene->geometries).items[uVar23].ptr;
                              if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                                auVar139._0_4_ = fVar202 * (float)local_148._0_4_;
                                auVar139._4_4_ = fVar202 * (float)local_148._4_4_;
                                auVar139._8_4_ = fVar202 * fStack_140;
                                auVar139._12_4_ = fVar202 * fStack_13c;
                                auVar125._4_4_ = fVar199;
                                auVar125._0_4_ = fVar199;
                                auVar125._8_4_ = fVar199;
                                auVar125._12_4_ = fVar199;
                                auVar32 = vfmadd132ps_fma(auVar125,auVar139,local_138);
                                auVar114._4_4_ = fVar197;
                                auVar114._0_4_ = fVar197;
                                auVar114._8_4_ = fVar197;
                                auVar114._12_4_ = fVar197;
                                auVar32 = vfmadd132ps_fma(auVar114,auVar32,local_128);
                                auVar105._4_4_ = fVar185;
                                auVar105._0_4_ = fVar185;
                                auVar105._8_4_ = fVar185;
                                auVar105._12_4_ = fVar185;
                                auVar40 = vfmadd132ps_fma(auVar105,auVar32,local_118);
                                auVar32 = vshufps_avx(auVar40,auVar40,0xc9);
                                auVar41 = vshufps_avx(auVar31,auVar31,0xc9);
                                auVar106._0_4_ = auVar40._0_4_ * auVar41._0_4_;
                                auVar106._4_4_ = auVar40._4_4_ * auVar41._4_4_;
                                auVar106._8_4_ = auVar40._8_4_ * auVar41._8_4_;
                                auVar106._12_4_ = auVar40._12_4_ * auVar41._12_4_;
                                auVar31 = vfmsub231ps_fma(auVar106,auVar31,auVar32);
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                  (ray->super_RayK<1>).tfar = fVar201;
                                  auVar32 = vshufps_avx(auVar31,auVar31,0xe9);
                                  uVar10 = vmovlps_avx(auVar32);
                                  *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                                  (ray->Ng).field_0.field_0.z = auVar31._0_4_;
                                  uVar10 = vmovlps_avx(auVar30);
                                  ray->u = (float)(int)uVar10;
                                  ray->v = (float)(int)((ulong)uVar10 >> 0x20);
                                  ray->primID = (uint)local_300;
                                  ray->geomID = uVar23;
                                  ray->instID[0] = context->user->instID[0];
                                  ray->instPrimID[0] = context->user->instPrimID[0];
                                }
                                else {
                                  auVar32 = vshufps_avx(auVar31,auVar31,0xe9);
                                  local_188 = vmovlps_avx(auVar32);
                                  local_180 = auVar31._0_4_;
                                  local_17c = vmovlps_avx(auVar30);
                                  local_174 = (uint)local_300;
                                  local_170 = uVar23;
                                  local_16c = context->user->instID[0];
                                  local_168 = context->user->instPrimID[0];
                                  (ray->super_RayK<1>).tfar = fVar201;
                                  local_304 = -1;
                                  local_288.valid = &local_304;
                                  local_288.geometryUserPtr = pGVar6->userPtr;
                                  local_288.context = context->user;
                                  local_288.ray = (RTCRayN *)ray;
                                  local_288.hit = (RTCHitN *)&local_188;
                                  local_288.N = 1;
                                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a73b44:
                                    p_Var7 = context->args->filter;
                                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var7)(&local_288);
                                      auVar239 = ZEXT464(0x3f800000);
                                      auVar236 = ZEXT3264(_DAT_01feed20);
                                      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar235 = ZEXT1664(auVar30);
                                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar234 = ZEXT3264(auVar66);
                                      auVar59._16_16_ = auVar66._16_16_;
                                      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar233 = ZEXT1664(auVar30);
                                      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar232 = ZEXT1664(auVar30);
                                      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar238 = ZEXT1664(auVar30);
                                      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar237 = ZEXT1664(auVar30);
                                      if (*local_288.valid == 0) goto LAB_01a73c5e;
                                    }
                                    (((Vec3f *)((long)local_288.ray + 0x30))->field_0).components[0]
                                         = *(float *)local_288.hit;
                                    (((Vec3f *)((long)local_288.ray + 0x30))->field_0).field_0.y =
                                         *(float *)(local_288.hit + 4);
                                    (((Vec3f *)((long)local_288.ray + 0x30))->field_0).field_0.z =
                                         *(float *)(local_288.hit + 8);
                                    *(float *)((long)local_288.ray + 0x3c) =
                                         *(float *)(local_288.hit + 0xc);
                                    *(float *)((long)local_288.ray + 0x40) =
                                         *(float *)(local_288.hit + 0x10);
                                    *(float *)((long)local_288.ray + 0x44) =
                                         *(float *)(local_288.hit + 0x14);
                                    *(float *)((long)local_288.ray + 0x48) =
                                         *(float *)(local_288.hit + 0x18);
                                    *(float *)((long)local_288.ray + 0x4c) =
                                         *(float *)(local_288.hit + 0x1c);
                                    *(float *)((long)local_288.ray + 0x50) =
                                         *(float *)(local_288.hit + 0x20);
                                  }
                                  else {
                                    (*pGVar6->intersectionFilterN)(&local_288);
                                    auVar239 = ZEXT464(0x3f800000);
                                    auVar236 = ZEXT3264(_DAT_01feed20);
                                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar235 = ZEXT1664(auVar30);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar234 = ZEXT3264(auVar66);
                                    auVar59._16_16_ = auVar66._16_16_;
                                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar233 = ZEXT1664(auVar30);
                                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar232 = ZEXT1664(auVar30);
                                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar238 = ZEXT1664(auVar30);
                                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar237 = ZEXT1664(auVar30);
                                    if (*local_288.valid != 0) goto LAB_01a73b44;
LAB_01a73c5e:
                                    auVar239 = ZEXT464(0x3f800000);
                                    (ray->super_RayK<1>).tfar = fVar203;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar20 = lVar20 + -1;
                } while (lVar20 != 0);
              }
            }
          }
          auVar240 = ZEXT1664(local_1c8);
          auVar66._16_16_ = auVar59._16_16_;
          auVar66._0_16_ = local_1d8;
          auVar241 = ZEXT1664(local_1d8);
          if (uVar17 == 0) break;
        } while( true );
      }
      fVar204 = (ray->super_RayK<1>).tfar;
      auVar14._4_4_ = fVar204;
      auVar14._0_4_ = fVar204;
      auVar14._8_4_ = fVar204;
      auVar14._12_4_ = fVar204;
      uVar10 = vcmpps_avx512vl(local_158,auVar14,2);
      uVar23 = (uint)uVar29 & (uint)uVar10;
      uVar29 = (ulong)uVar23;
    } while (uVar23 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }